

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::sse2::CurveNiMBIntersectorK<4,4>::
     intersect_n<embree::sse2::OrientedCurve1IntersectorK<embree::BSplineCurveT,4>,embree::sse2::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  Primitive *pPVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  Primitive PVar13;
  undefined4 uVar14;
  Geometry *pGVar15;
  __int_type_conflict _Var16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  undefined3 uVar26;
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  undefined8 uVar29;
  undefined6 uVar30;
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  undefined1 auVar50 [12];
  undefined1 auVar51 [12];
  byte bVar52;
  uint uVar53;
  ulong uVar54;
  ulong uVar55;
  RTCFilterFunctionN p_Var56;
  RayHitK<4> *pRVar57;
  ulong uVar58;
  long lVar59;
  ulong uVar60;
  bool bVar61;
  uint uVar62;
  int iVar63;
  uint uVar64;
  int iVar65;
  uint uVar66;
  uint uVar67;
  short sVar68;
  undefined2 uVar106;
  float fVar69;
  float fVar107;
  float fVar108;
  vfloat_impl<4> p00;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar75 [16];
  undefined1 auVar78 [16];
  undefined1 auVar81 [16];
  undefined1 auVar84 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  float fVar109;
  float fVar135;
  float fVar136;
  undefined1 auVar110 [16];
  undefined1 auVar113 [16];
  undefined1 auVar116 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  float fVar137;
  float fVar148;
  float fVar149;
  vfloat4 v;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  float fVar150;
  float fVar158;
  float fVar160;
  vfloat4 v_1;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar155 [16];
  float fVar159;
  float fVar161;
  float fVar162;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  float fVar163;
  float fVar164;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  float fVar180;
  float fVar206;
  float fVar207;
  undefined1 auVar181 [16];
  undefined1 auVar184 [16];
  undefined1 auVar187 [16];
  undefined1 auVar190 [16];
  undefined1 auVar193 [16];
  undefined1 auVar196 [16];
  float fVar208;
  float fVar209;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  float fVar210;
  float fVar211;
  float fVar214;
  float fVar216;
  undefined1 auVar212 [16];
  float fVar215;
  float fVar217;
  float fVar218;
  undefined1 auVar213 [16];
  float fVar219;
  float fVar220;
  float fVar221;
  float fVar222;
  float fVar235;
  float fVar239;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar227 [16];
  float fVar236;
  float fVar237;
  float fVar238;
  float fVar240;
  float fVar241;
  float fVar242;
  float fVar243;
  float fVar244;
  float fVar245;
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  float fVar246;
  float fVar255;
  float fVar256;
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  float fVar257;
  float fVar270;
  float fVar271;
  undefined1 auVar258 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  float fVar272;
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  float fVar273;
  float fVar283;
  float fVar284;
  vfloat4 a;
  undefined1 auVar274 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  float fVar285;
  float fVar286;
  float fVar297;
  float fVar299;
  vfloat4 a_2;
  float fVar301;
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar291 [16];
  float fVar298;
  float fVar300;
  float fVar302;
  float fVar303;
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  float fVar304;
  float fVar305;
  float fVar314;
  float fVar316;
  float fVar318;
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar310 [16];
  float fVar315;
  float fVar317;
  float fVar319;
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  float fVar320;
  float fVar321;
  float fVar322;
  float fVar325;
  float fVar326;
  float fVar327;
  float fVar328;
  float fVar329;
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  float fVar330;
  float fVar331;
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  vfloat_impl<4> p01;
  vfloat_impl<4> p00_1;
  vfloat_impl<4> p02;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_508 [8];
  float fStack_500;
  float fStack_4fc;
  undefined8 local_4f8;
  undefined1 local_3b8 [16];
  undefined1 (*local_3a0) [16];
  Primitive *local_398;
  ulong local_390;
  RTCFilterFunctionNArguments local_388;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  undefined1 local_348 [16];
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  undefined1 local_328 [16];
  uint auStack_318 [4];
  uint local_308;
  uint uStack_304;
  uint uStack_300;
  uint uStack_2fc;
  uint local_2f8;
  uint uStack_2f4;
  uint uStack_2f0;
  uint uStack_2ec;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  undefined1 local_288 [16];
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  undefined1 local_118 [8];
  float fStack_110;
  float fStack_10c;
  float afStack_108 [8];
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  float afStack_58 [10];
  undefined1 auVar102 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 uVar105;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  
  PVar13 = prim[1];
  uVar54 = (ulong)(byte)PVar13;
  lVar20 = uVar54 * 0x25;
  pPVar4 = prim + lVar20 + 6;
  fVar149 = *(float *)(pPVar4 + 0xc);
  fVar150 = (*(float *)(ray + k * 4) - *(float *)pPVar4) * fVar149;
  fVar158 = (*(float *)(ray + k * 4 + 0x10) - *(float *)(pPVar4 + 4)) * fVar149;
  fVar160 = (*(float *)(ray + k * 4 + 0x20) - *(float *)(pPVar4 + 8)) * fVar149;
  fVar137 = *(float *)(ray + k * 4 + 0x40) * fVar149;
  fVar148 = *(float *)(ray + k * 4 + 0x50) * fVar149;
  fVar149 = *(float *)(ray + k * 4 + 0x60) * fVar149;
  uVar14 = *(undefined4 *)(prim + uVar54 * 4 + 6);
  uVar105 = (undefined1)((uint)uVar14 >> 0x18);
  uVar106 = CONCAT11(uVar105,uVar105);
  uVar105 = (undefined1)((uint)uVar14 >> 0x10);
  uVar29 = CONCAT35(CONCAT21(uVar106,uVar105),CONCAT14(uVar105,uVar14));
  uVar105 = (undefined1)((uint)uVar14 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar29 >> 0x20),uVar105),uVar105);
  sVar68 = CONCAT11((char)uVar14,(char)uVar14);
  uVar55 = CONCAT62(uVar30,sVar68);
  auVar262._8_4_ = 0;
  auVar262._0_8_ = uVar55;
  auVar262._12_2_ = uVar106;
  auVar262._14_2_ = uVar106;
  uVar106 = (undefined2)((ulong)uVar29 >> 0x20);
  auVar139._12_4_ = auVar262._12_4_;
  auVar139._8_2_ = 0;
  auVar139._0_8_ = uVar55;
  auVar139._10_2_ = uVar106;
  auVar70._10_6_ = auVar139._10_6_;
  auVar70._8_2_ = uVar106;
  auVar70._0_8_ = uVar55;
  uVar106 = (undefined2)uVar30;
  auVar31._4_8_ = auVar70._8_8_;
  auVar31._2_2_ = uVar106;
  auVar31._0_2_ = uVar106;
  fVar320 = (float)((int)sVar68 >> 8);
  fVar325 = (float)(auVar31._0_4_ >> 0x18);
  fVar327 = (float)(auVar70._8_4_ >> 0x18);
  uVar14 = *(undefined4 *)(prim + uVar54 * 5 + 6);
  uVar105 = (undefined1)((uint)uVar14 >> 0x18);
  uVar106 = CONCAT11(uVar105,uVar105);
  uVar105 = (undefined1)((uint)uVar14 >> 0x10);
  uVar29 = CONCAT35(CONCAT21(uVar106,uVar105),CONCAT14(uVar105,uVar14));
  uVar105 = (undefined1)((uint)uVar14 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar29 >> 0x20),uVar105),uVar105);
  sVar68 = CONCAT11((char)uVar14,(char)uVar14);
  uVar55 = CONCAT62(uVar30,sVar68);
  auVar112._8_4_ = 0;
  auVar112._0_8_ = uVar55;
  auVar112._12_2_ = uVar106;
  auVar112._14_2_ = uVar106;
  uVar106 = (undefined2)((ulong)uVar29 >> 0x20);
  auVar111._12_4_ = auVar112._12_4_;
  auVar111._8_2_ = 0;
  auVar111._0_8_ = uVar55;
  auVar111._10_2_ = uVar106;
  auVar110._10_6_ = auVar111._10_6_;
  auVar110._8_2_ = uVar106;
  auVar110._0_8_ = uVar55;
  uVar106 = (undefined2)uVar30;
  auVar32._4_8_ = auVar110._8_8_;
  auVar32._2_2_ = uVar106;
  auVar32._0_2_ = uVar106;
  fVar163 = (float)((int)sVar68 >> 8);
  fVar175 = (float)(auVar32._0_4_ >> 0x18);
  fVar177 = (float)(auVar110._8_4_ >> 0x18);
  uVar14 = *(undefined4 *)(prim + uVar54 * 6 + 6);
  uVar105 = (undefined1)((uint)uVar14 >> 0x18);
  uVar106 = CONCAT11(uVar105,uVar105);
  uVar105 = (undefined1)((uint)uVar14 >> 0x10);
  uVar29 = CONCAT35(CONCAT21(uVar106,uVar105),CONCAT14(uVar105,uVar14));
  uVar105 = (undefined1)((uint)uVar14 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar29 >> 0x20),uVar105),uVar105);
  sVar68 = CONCAT11((char)uVar14,(char)uVar14);
  uVar55 = CONCAT62(uVar30,sVar68);
  auVar115._8_4_ = 0;
  auVar115._0_8_ = uVar55;
  auVar115._12_2_ = uVar106;
  auVar115._14_2_ = uVar106;
  uVar106 = (undefined2)((ulong)uVar29 >> 0x20);
  auVar114._12_4_ = auVar115._12_4_;
  auVar114._8_2_ = 0;
  auVar114._0_8_ = uVar55;
  auVar114._10_2_ = uVar106;
  auVar113._10_6_ = auVar114._10_6_;
  auVar113._8_2_ = uVar106;
  auVar113._0_8_ = uVar55;
  uVar106 = (undefined2)uVar30;
  auVar33._4_8_ = auVar113._8_8_;
  auVar33._2_2_ = uVar106;
  auVar33._0_2_ = uVar106;
  fVar210 = (float)((int)sVar68 >> 8);
  fVar214 = (float)(auVar33._0_4_ >> 0x18);
  fVar216 = (float)(auVar113._8_4_ >> 0x18);
  uVar14 = *(undefined4 *)(prim + uVar54 * 0xf + 6);
  uVar105 = (undefined1)((uint)uVar14 >> 0x18);
  uVar106 = CONCAT11(uVar105,uVar105);
  uVar105 = (undefined1)((uint)uVar14 >> 0x10);
  uVar29 = CONCAT35(CONCAT21(uVar106,uVar105),CONCAT14(uVar105,uVar14));
  uVar105 = (undefined1)((uint)uVar14 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar29 >> 0x20),uVar105),uVar105);
  sVar68 = CONCAT11((char)uVar14,(char)uVar14);
  uVar55 = CONCAT62(uVar30,sVar68);
  auVar118._8_4_ = 0;
  auVar118._0_8_ = uVar55;
  auVar118._12_2_ = uVar106;
  auVar118._14_2_ = uVar106;
  uVar106 = (undefined2)((ulong)uVar29 >> 0x20);
  auVar117._12_4_ = auVar118._12_4_;
  auVar117._8_2_ = 0;
  auVar117._0_8_ = uVar55;
  auVar117._10_2_ = uVar106;
  auVar116._10_6_ = auVar117._10_6_;
  auVar116._8_2_ = uVar106;
  auVar116._0_8_ = uVar55;
  uVar106 = (undefined2)uVar30;
  auVar34._4_8_ = auVar116._8_8_;
  auVar34._2_2_ = uVar106;
  auVar34._0_2_ = uVar106;
  fVar69 = (float)((int)sVar68 >> 8);
  fVar107 = (float)(auVar34._0_4_ >> 0x18);
  fVar108 = (float)(auVar116._8_4_ >> 0x18);
  uVar14 = *(undefined4 *)(prim + (ulong)(byte)PVar13 * 0x10 + 6);
  uVar105 = (undefined1)((uint)uVar14 >> 0x18);
  uVar106 = CONCAT11(uVar105,uVar105);
  uVar105 = (undefined1)((uint)uVar14 >> 0x10);
  uVar29 = CONCAT35(CONCAT21(uVar106,uVar105),CONCAT14(uVar105,uVar14));
  uVar105 = (undefined1)((uint)uVar14 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar29 >> 0x20),uVar105),uVar105);
  sVar68 = CONCAT11((char)uVar14,(char)uVar14);
  uVar55 = CONCAT62(uVar30,sVar68);
  auVar183._8_4_ = 0;
  auVar183._0_8_ = uVar55;
  auVar183._12_2_ = uVar106;
  auVar183._14_2_ = uVar106;
  uVar106 = (undefined2)((ulong)uVar29 >> 0x20);
  auVar182._12_4_ = auVar183._12_4_;
  auVar182._8_2_ = 0;
  auVar182._0_8_ = uVar55;
  auVar182._10_2_ = uVar106;
  auVar181._10_6_ = auVar182._10_6_;
  auVar181._8_2_ = uVar106;
  auVar181._0_8_ = uVar55;
  uVar106 = (undefined2)uVar30;
  auVar35._4_8_ = auVar181._8_8_;
  auVar35._2_2_ = uVar106;
  auVar35._0_2_ = uVar106;
  fVar219 = (float)((int)sVar68 >> 8);
  fVar235 = (float)(auVar35._0_4_ >> 0x18);
  fVar239 = (float)(auVar181._8_4_ >> 0x18);
  uVar14 = *(undefined4 *)(prim + (ulong)(byte)PVar13 * 0x10 + uVar54 + 6);
  uVar105 = (undefined1)((uint)uVar14 >> 0x18);
  uVar106 = CONCAT11(uVar105,uVar105);
  uVar105 = (undefined1)((uint)uVar14 >> 0x10);
  uVar29 = CONCAT35(CONCAT21(uVar106,uVar105),CONCAT14(uVar105,uVar14));
  uVar105 = (undefined1)((uint)uVar14 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar29 >> 0x20),uVar105),uVar105);
  sVar68 = CONCAT11((char)uVar14,(char)uVar14);
  uVar55 = CONCAT62(uVar30,sVar68);
  auVar186._8_4_ = 0;
  auVar186._0_8_ = uVar55;
  auVar186._12_2_ = uVar106;
  auVar186._14_2_ = uVar106;
  uVar106 = (undefined2)((ulong)uVar29 >> 0x20);
  auVar185._12_4_ = auVar186._12_4_;
  auVar185._8_2_ = 0;
  auVar185._0_8_ = uVar55;
  auVar185._10_2_ = uVar106;
  auVar184._10_6_ = auVar185._10_6_;
  auVar184._8_2_ = uVar106;
  auVar184._0_8_ = uVar55;
  uVar106 = (undefined2)uVar30;
  auVar36._4_8_ = auVar184._8_8_;
  auVar36._2_2_ = uVar106;
  auVar36._0_2_ = uVar106;
  fVar257 = (float)((int)sVar68 >> 8);
  fVar270 = (float)(auVar36._0_4_ >> 0x18);
  fVar271 = (float)(auVar184._8_4_ >> 0x18);
  uVar14 = *(undefined4 *)(prim + uVar54 * 0x1a + 6);
  uVar105 = (undefined1)((uint)uVar14 >> 0x18);
  uVar106 = CONCAT11(uVar105,uVar105);
  uVar105 = (undefined1)((uint)uVar14 >> 0x10);
  uVar29 = CONCAT35(CONCAT21(uVar106,uVar105),CONCAT14(uVar105,uVar14));
  uVar105 = (undefined1)((uint)uVar14 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar29 >> 0x20),uVar105),uVar105);
  sVar68 = CONCAT11((char)uVar14,(char)uVar14);
  uVar55 = CONCAT62(uVar30,sVar68);
  auVar189._8_4_ = 0;
  auVar189._0_8_ = uVar55;
  auVar189._12_2_ = uVar106;
  auVar189._14_2_ = uVar106;
  uVar106 = (undefined2)((ulong)uVar29 >> 0x20);
  auVar188._12_4_ = auVar189._12_4_;
  auVar188._8_2_ = 0;
  auVar188._0_8_ = uVar55;
  auVar188._10_2_ = uVar106;
  auVar187._10_6_ = auVar188._10_6_;
  auVar187._8_2_ = uVar106;
  auVar187._0_8_ = uVar55;
  uVar106 = (undefined2)uVar30;
  auVar37._4_8_ = auVar187._8_8_;
  auVar37._2_2_ = uVar106;
  auVar37._0_2_ = uVar106;
  fVar246 = (float)((int)sVar68 >> 8);
  fVar255 = (float)(auVar37._0_4_ >> 0x18);
  fVar256 = (float)(auVar187._8_4_ >> 0x18);
  uVar14 = *(undefined4 *)(prim + uVar54 * 0x1b + 6);
  uVar105 = (undefined1)((uint)uVar14 >> 0x18);
  uVar106 = CONCAT11(uVar105,uVar105);
  uVar105 = (undefined1)((uint)uVar14 >> 0x10);
  uVar29 = CONCAT35(CONCAT21(uVar106,uVar105),CONCAT14(uVar105,uVar14));
  uVar105 = (undefined1)((uint)uVar14 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar29 >> 0x20),uVar105),uVar105);
  sVar68 = CONCAT11((char)uVar14,(char)uVar14);
  uVar55 = CONCAT62(uVar30,sVar68);
  auVar192._8_4_ = 0;
  auVar192._0_8_ = uVar55;
  auVar192._12_2_ = uVar106;
  auVar192._14_2_ = uVar106;
  uVar106 = (undefined2)((ulong)uVar29 >> 0x20);
  auVar191._12_4_ = auVar192._12_4_;
  auVar191._8_2_ = 0;
  auVar191._0_8_ = uVar55;
  auVar191._10_2_ = uVar106;
  auVar190._10_6_ = auVar191._10_6_;
  auVar190._8_2_ = uVar106;
  auVar190._0_8_ = uVar55;
  uVar106 = (undefined2)uVar30;
  auVar38._4_8_ = auVar190._8_8_;
  auVar38._2_2_ = uVar106;
  auVar38._0_2_ = uVar106;
  fVar273 = (float)((int)sVar68 >> 8);
  fVar283 = (float)(auVar38._0_4_ >> 0x18);
  fVar284 = (float)(auVar190._8_4_ >> 0x18);
  uVar14 = *(undefined4 *)(prim + uVar54 * 0x1c + 6);
  uVar105 = (undefined1)((uint)uVar14 >> 0x18);
  uVar106 = CONCAT11(uVar105,uVar105);
  uVar105 = (undefined1)((uint)uVar14 >> 0x10);
  uVar29 = CONCAT35(CONCAT21(uVar106,uVar105),CONCAT14(uVar105,uVar14));
  uVar105 = (undefined1)((uint)uVar14 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar29 >> 0x20),uVar105),uVar105);
  sVar68 = CONCAT11((char)uVar14,(char)uVar14);
  uVar55 = CONCAT62(uVar30,sVar68);
  auVar195._8_4_ = 0;
  auVar195._0_8_ = uVar55;
  auVar195._12_2_ = uVar106;
  auVar195._14_2_ = uVar106;
  uVar106 = (undefined2)((ulong)uVar29 >> 0x20);
  auVar194._12_4_ = auVar195._12_4_;
  auVar194._8_2_ = 0;
  auVar194._0_8_ = uVar55;
  auVar194._10_2_ = uVar106;
  auVar193._10_6_ = auVar194._10_6_;
  auVar193._8_2_ = uVar106;
  auVar193._0_8_ = uVar55;
  uVar106 = (undefined2)uVar30;
  auVar39._4_8_ = auVar193._8_8_;
  auVar39._2_2_ = uVar106;
  auVar39._0_2_ = uVar106;
  fVar109 = (float)((int)sVar68 >> 8);
  fVar135 = (float)(auVar39._0_4_ >> 0x18);
  fVar136 = (float)(auVar193._8_4_ >> 0x18);
  fVar304 = fVar137 * fVar320 + fVar148 * fVar163 + fVar149 * fVar210;
  fVar314 = fVar137 * fVar325 + fVar148 * fVar175 + fVar149 * fVar214;
  fVar316 = fVar137 * fVar327 + fVar148 * fVar177 + fVar149 * fVar216;
  fVar318 = fVar137 * (float)(auVar139._12_4_ >> 0x18) +
            fVar148 * (float)(auVar111._12_4_ >> 0x18) + fVar149 * (float)(auVar114._12_4_ >> 0x18);
  fVar285 = fVar137 * fVar69 + fVar148 * fVar219 + fVar149 * fVar257;
  fVar297 = fVar137 * fVar107 + fVar148 * fVar235 + fVar149 * fVar270;
  fVar299 = fVar137 * fVar108 + fVar148 * fVar239 + fVar149 * fVar271;
  fVar301 = fVar137 * (float)(auVar117._12_4_ >> 0x18) +
            fVar148 * (float)(auVar182._12_4_ >> 0x18) + fVar149 * (float)(auVar185._12_4_ >> 0x18);
  fVar180 = fVar137 * fVar246 + fVar148 * fVar273 + fVar149 * fVar109;
  fVar206 = fVar137 * fVar255 + fVar148 * fVar283 + fVar149 * fVar135;
  fVar207 = fVar137 * fVar256 + fVar148 * fVar284 + fVar149 * fVar136;
  fVar137 = fVar137 * (float)(auVar188._12_4_ >> 0x18) +
            fVar148 * (float)(auVar191._12_4_ >> 0x18) + fVar149 * (float)(auVar194._12_4_ >> 0x18);
  fVar321 = fVar320 * fVar150 + fVar163 * fVar158 + fVar210 * fVar160;
  fVar325 = fVar325 * fVar150 + fVar175 * fVar158 + fVar214 * fVar160;
  fVar327 = fVar327 * fVar150 + fVar177 * fVar158 + fVar216 * fVar160;
  fVar328 = (float)(auVar139._12_4_ >> 0x18) * fVar150 +
            (float)(auVar111._12_4_ >> 0x18) * fVar158 + (float)(auVar114._12_4_ >> 0x18) * fVar160;
  fVar257 = fVar69 * fVar150 + fVar219 * fVar158 + fVar257 * fVar160;
  fVar270 = fVar107 * fVar150 + fVar235 * fVar158 + fVar270 * fVar160;
  fVar271 = fVar108 * fVar150 + fVar239 * fVar158 + fVar271 * fVar160;
  fVar320 = (float)(auVar117._12_4_ >> 0x18) * fVar150 +
            (float)(auVar182._12_4_ >> 0x18) * fVar158 + (float)(auVar185._12_4_ >> 0x18) * fVar160;
  fVar246 = fVar150 * fVar246 + fVar158 * fVar273 + fVar160 * fVar109;
  fVar255 = fVar150 * fVar255 + fVar158 * fVar283 + fVar160 * fVar135;
  fVar256 = fVar150 * fVar256 + fVar158 * fVar284 + fVar160 * fVar136;
  fVar273 = fVar150 * (float)(auVar188._12_4_ >> 0x18) +
            fVar158 * (float)(auVar191._12_4_ >> 0x18) + fVar160 * (float)(auVar194._12_4_ >> 0x18);
  fVar149 = (float)DAT_01f80d30;
  fVar69 = DAT_01f80d30._4_4_;
  fVar107 = DAT_01f80d30._8_4_;
  fVar108 = DAT_01f80d30._12_4_;
  uVar62 = -(uint)(fVar149 <= ABS(fVar304));
  uVar64 = -(uint)(fVar69 <= ABS(fVar314));
  uVar66 = -(uint)(fVar107 <= ABS(fVar316));
  uVar67 = -(uint)(fVar108 <= ABS(fVar318));
  auVar306._0_4_ = (uint)fVar304 & uVar62;
  auVar306._4_4_ = (uint)fVar314 & uVar64;
  auVar306._8_4_ = (uint)fVar316 & uVar66;
  auVar306._12_4_ = (uint)fVar318 & uVar67;
  auVar151._0_4_ = ~uVar62 & (uint)fVar149;
  auVar151._4_4_ = ~uVar64 & (uint)fVar69;
  auVar151._8_4_ = ~uVar66 & (uint)fVar107;
  auVar151._12_4_ = ~uVar67 & (uint)fVar108;
  auVar151 = auVar151 | auVar306;
  uVar62 = -(uint)(fVar149 <= ABS(fVar285));
  uVar64 = -(uint)(fVar69 <= ABS(fVar297));
  uVar66 = -(uint)(fVar107 <= ABS(fVar299));
  uVar67 = -(uint)(fVar108 <= ABS(fVar301));
  auVar287._0_4_ = (uint)fVar285 & uVar62;
  auVar287._4_4_ = (uint)fVar297 & uVar64;
  auVar287._8_4_ = (uint)fVar299 & uVar66;
  auVar287._12_4_ = (uint)fVar301 & uVar67;
  auVar212._0_4_ = ~uVar62 & (uint)fVar149;
  auVar212._4_4_ = ~uVar64 & (uint)fVar69;
  auVar212._8_4_ = ~uVar66 & (uint)fVar107;
  auVar212._12_4_ = ~uVar67 & (uint)fVar108;
  auVar212 = auVar212 | auVar287;
  uVar62 = -(uint)(fVar149 <= ABS(fVar180));
  uVar64 = -(uint)(fVar69 <= ABS(fVar206));
  uVar66 = -(uint)(fVar107 <= ABS(fVar207));
  uVar67 = -(uint)(fVar108 <= ABS(fVar137));
  auVar196._0_4_ = (uint)fVar180 & uVar62;
  auVar196._4_4_ = (uint)fVar206 & uVar64;
  auVar196._8_4_ = (uint)fVar207 & uVar66;
  auVar196._12_4_ = (uint)fVar137 & uVar67;
  auVar223._0_4_ = ~uVar62 & (uint)fVar149;
  auVar223._4_4_ = ~uVar64 & (uint)fVar69;
  auVar223._8_4_ = ~uVar66 & (uint)fVar107;
  auVar223._12_4_ = ~uVar67 & (uint)fVar108;
  auVar223 = auVar223 | auVar196;
  auVar70 = rcpps(_DAT_01f80d30,auVar151);
  fVar149 = auVar70._0_4_;
  fVar108 = auVar70._4_4_;
  fVar163 = auVar70._8_4_;
  fVar219 = auVar70._12_4_;
  fVar149 = (1.0 - auVar151._0_4_ * fVar149) * fVar149 + fVar149;
  fVar108 = (1.0 - auVar151._4_4_ * fVar108) * fVar108 + fVar108;
  fVar163 = (1.0 - auVar151._8_4_ * fVar163) * fVar163 + fVar163;
  fVar219 = (1.0 - auVar151._12_4_ * fVar219) * fVar219 + fVar219;
  auVar70 = rcpps(auVar70,auVar212);
  fVar69 = auVar70._0_4_;
  fVar109 = auVar70._4_4_;
  fVar175 = auVar70._8_4_;
  fVar235 = auVar70._12_4_;
  fVar69 = (1.0 - auVar212._0_4_ * fVar69) * fVar69 + fVar69;
  fVar109 = (1.0 - auVar212._4_4_ * fVar109) * fVar109 + fVar109;
  fVar175 = (1.0 - auVar212._8_4_ * fVar175) * fVar175 + fVar175;
  fVar235 = (1.0 - auVar212._12_4_ * fVar235) * fVar235 + fVar235;
  auVar70 = rcpps(auVar70,auVar223);
  fVar107 = auVar70._0_4_;
  fVar135 = auVar70._4_4_;
  fVar177 = auVar70._8_4_;
  fVar239 = auVar70._12_4_;
  fVar107 = (1.0 - auVar223._0_4_ * fVar107) * fVar107 + fVar107;
  fVar135 = (1.0 - auVar223._4_4_ * fVar135) * fVar135 + fVar135;
  fVar177 = (1.0 - auVar223._8_4_ * fVar177) * fVar177 + fVar177;
  fVar239 = (1.0 - auVar223._12_4_ * fVar239) * fVar239 + fVar239;
  fVar283 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar20 + 0x16)) *
            *(float *)(prim + lVar20 + 0x1a);
  uVar55 = *(ulong *)(prim + uVar54 * 7 + 6);
  uVar106 = (undefined2)(uVar55 >> 0x30);
  auVar264._8_4_ = 0;
  auVar264._0_8_ = uVar55;
  auVar264._12_2_ = uVar106;
  auVar264._14_2_ = uVar106;
  uVar106 = (undefined2)(uVar55 >> 0x20);
  auVar71._12_4_ = auVar264._12_4_;
  auVar71._8_2_ = 0;
  auVar71._0_8_ = uVar55;
  auVar71._10_2_ = uVar106;
  auVar141._10_6_ = auVar71._10_6_;
  auVar141._8_2_ = uVar106;
  auVar141._0_8_ = uVar55;
  uVar106 = (undefined2)(uVar55 >> 0x10);
  auVar40._4_8_ = auVar141._8_8_;
  auVar40._2_2_ = uVar106;
  auVar40._0_2_ = uVar106;
  fVar136 = (float)(auVar40._0_4_ >> 0x10);
  fVar180 = (float)(auVar141._8_4_ >> 0x10);
  uVar60 = *(ulong *)(prim + uVar54 * 0xb + 6);
  uVar106 = (undefined2)(uVar60 >> 0x30);
  auVar154._8_4_ = 0;
  auVar154._0_8_ = uVar60;
  auVar154._12_2_ = uVar106;
  auVar154._14_2_ = uVar106;
  uVar106 = (undefined2)(uVar60 >> 0x20);
  auVar153._12_4_ = auVar154._12_4_;
  auVar153._8_2_ = 0;
  auVar153._0_8_ = uVar60;
  auVar153._10_2_ = uVar106;
  auVar152._10_6_ = auVar153._10_6_;
  auVar152._8_2_ = uVar106;
  auVar152._0_8_ = uVar60;
  uVar106 = (undefined2)(uVar60 >> 0x10);
  auVar41._4_8_ = auVar152._8_8_;
  auVar41._2_2_ = uVar106;
  auVar41._0_2_ = uVar106;
  uVar5 = *(ulong *)(prim + uVar54 * 9 + 6);
  uVar106 = (undefined2)(uVar5 >> 0x30);
  auVar74._8_4_ = 0;
  auVar74._0_8_ = uVar5;
  auVar74._12_2_ = uVar106;
  auVar74._14_2_ = uVar106;
  uVar106 = (undefined2)(uVar5 >> 0x20);
  auVar73._12_4_ = auVar74._12_4_;
  auVar73._8_2_ = 0;
  auVar73._0_8_ = uVar5;
  auVar73._10_2_ = uVar106;
  auVar72._10_6_ = auVar73._10_6_;
  auVar72._8_2_ = uVar106;
  auVar72._0_8_ = uVar5;
  uVar106 = (undefined2)(uVar5 >> 0x10);
  auVar42._4_8_ = auVar72._8_8_;
  auVar42._2_2_ = uVar106;
  auVar42._0_2_ = uVar106;
  fVar137 = (float)(auVar42._0_4_ >> 0x10);
  fVar206 = (float)(auVar72._8_4_ >> 0x10);
  uVar6 = *(ulong *)(prim + uVar54 * 0xd + 6);
  uVar106 = (undefined2)(uVar6 >> 0x30);
  auVar226._8_4_ = 0;
  auVar226._0_8_ = uVar6;
  auVar226._12_2_ = uVar106;
  auVar226._14_2_ = uVar106;
  uVar106 = (undefined2)(uVar6 >> 0x20);
  auVar225._12_4_ = auVar226._12_4_;
  auVar225._8_2_ = 0;
  auVar225._0_8_ = uVar6;
  auVar225._10_2_ = uVar106;
  auVar224._10_6_ = auVar225._10_6_;
  auVar224._8_2_ = uVar106;
  auVar224._0_8_ = uVar6;
  uVar106 = (undefined2)(uVar6 >> 0x10);
  auVar43._4_8_ = auVar224._8_8_;
  auVar43._2_2_ = uVar106;
  auVar43._0_2_ = uVar106;
  uVar7 = *(ulong *)(prim + uVar54 * 0x12 + 6);
  uVar106 = (undefined2)(uVar7 >> 0x30);
  auVar77._8_4_ = 0;
  auVar77._0_8_ = uVar7;
  auVar77._12_2_ = uVar106;
  auVar77._14_2_ = uVar106;
  uVar106 = (undefined2)(uVar7 >> 0x20);
  auVar76._12_4_ = auVar77._12_4_;
  auVar76._8_2_ = 0;
  auVar76._0_8_ = uVar7;
  auVar76._10_2_ = uVar106;
  auVar75._10_6_ = auVar76._10_6_;
  auVar75._8_2_ = uVar106;
  auVar75._0_8_ = uVar7;
  uVar106 = (undefined2)(uVar7 >> 0x10);
  auVar44._4_8_ = auVar75._8_8_;
  auVar44._2_2_ = uVar106;
  auVar44._0_2_ = uVar106;
  fVar148 = (float)(auVar44._0_4_ >> 0x10);
  fVar207 = (float)(auVar75._8_4_ >> 0x10);
  uVar58 = (ulong)(uint)((int)(uVar54 * 5) << 2);
  uVar8 = *(ulong *)(prim + uVar54 * 2 + uVar58 + 6);
  uVar106 = (undefined2)(uVar8 >> 0x30);
  auVar260._8_4_ = 0;
  auVar260._0_8_ = uVar8;
  auVar260._12_2_ = uVar106;
  auVar260._14_2_ = uVar106;
  uVar106 = (undefined2)(uVar8 >> 0x20);
  auVar259._12_4_ = auVar260._12_4_;
  auVar259._8_2_ = 0;
  auVar259._0_8_ = uVar8;
  auVar259._10_2_ = uVar106;
  auVar258._10_6_ = auVar259._10_6_;
  auVar258._8_2_ = uVar106;
  auVar258._0_8_ = uVar8;
  uVar106 = (undefined2)(uVar8 >> 0x10);
  auVar45._4_8_ = auVar258._8_8_;
  auVar45._2_2_ = uVar106;
  auVar45._0_2_ = uVar106;
  uVar58 = *(ulong *)(prim + uVar58 + 6);
  uVar106 = (undefined2)(uVar58 >> 0x30);
  auVar80._8_4_ = 0;
  auVar80._0_8_ = uVar58;
  auVar80._12_2_ = uVar106;
  auVar80._14_2_ = uVar106;
  uVar106 = (undefined2)(uVar58 >> 0x20);
  auVar79._12_4_ = auVar80._12_4_;
  auVar79._8_2_ = 0;
  auVar79._0_8_ = uVar58;
  auVar79._10_2_ = uVar106;
  auVar78._10_6_ = auVar79._10_6_;
  auVar78._8_2_ = uVar106;
  auVar78._0_8_ = uVar58;
  uVar106 = (undefined2)(uVar58 >> 0x10);
  auVar46._4_8_ = auVar78._8_8_;
  auVar46._2_2_ = uVar106;
  auVar46._0_2_ = uVar106;
  fVar150 = (float)(auVar46._0_4_ >> 0x10);
  fVar210 = (float)(auVar78._8_4_ >> 0x10);
  uVar9 = *(ulong *)(prim + uVar54 * 0x18 + 6);
  uVar106 = (undefined2)(uVar9 >> 0x30);
  auVar276._8_4_ = 0;
  auVar276._0_8_ = uVar9;
  auVar276._12_2_ = uVar106;
  auVar276._14_2_ = uVar106;
  uVar106 = (undefined2)(uVar9 >> 0x20);
  auVar275._12_4_ = auVar276._12_4_;
  auVar275._8_2_ = 0;
  auVar275._0_8_ = uVar9;
  auVar275._10_2_ = uVar106;
  auVar274._10_6_ = auVar275._10_6_;
  auVar274._8_2_ = uVar106;
  auVar274._0_8_ = uVar9;
  uVar106 = (undefined2)(uVar9 >> 0x10);
  auVar47._4_8_ = auVar274._8_8_;
  auVar47._2_2_ = uVar106;
  auVar47._0_2_ = uVar106;
  uVar10 = *(ulong *)(prim + uVar54 * 0x1d + 6);
  uVar106 = (undefined2)(uVar10 >> 0x30);
  auVar83._8_4_ = 0;
  auVar83._0_8_ = uVar10;
  auVar83._12_2_ = uVar106;
  auVar83._14_2_ = uVar106;
  uVar106 = (undefined2)(uVar10 >> 0x20);
  auVar82._12_4_ = auVar83._12_4_;
  auVar82._8_2_ = 0;
  auVar82._0_8_ = uVar10;
  auVar82._10_2_ = uVar106;
  auVar81._10_6_ = auVar82._10_6_;
  auVar81._8_2_ = uVar106;
  auVar81._0_8_ = uVar10;
  uVar106 = (undefined2)(uVar10 >> 0x10);
  auVar48._4_8_ = auVar81._8_8_;
  auVar48._2_2_ = uVar106;
  auVar48._0_2_ = uVar106;
  fVar158 = (float)(auVar48._0_4_ >> 0x10);
  fVar214 = (float)(auVar81._8_4_ >> 0x10);
  uVar11 = *(ulong *)(prim + uVar54 + (ulong)(byte)PVar13 * 0x20 + 6);
  uVar106 = (undefined2)(uVar11 >> 0x30);
  auVar290._8_4_ = 0;
  auVar290._0_8_ = uVar11;
  auVar290._12_2_ = uVar106;
  auVar290._14_2_ = uVar106;
  uVar106 = (undefined2)(uVar11 >> 0x20);
  auVar289._12_4_ = auVar290._12_4_;
  auVar289._8_2_ = 0;
  auVar289._0_8_ = uVar11;
  auVar289._10_2_ = uVar106;
  auVar288._10_6_ = auVar289._10_6_;
  auVar288._8_2_ = uVar106;
  auVar288._0_8_ = uVar11;
  uVar106 = (undefined2)(uVar11 >> 0x10);
  auVar49._4_8_ = auVar288._8_8_;
  auVar49._2_2_ = uVar106;
  auVar49._0_2_ = uVar106;
  uVar12 = *(ulong *)(prim + ((ulong)(byte)PVar13 * 0x20 - uVar54) + 6);
  uVar106 = (undefined2)(uVar12 >> 0x30);
  auVar86._8_4_ = 0;
  auVar86._0_8_ = uVar12;
  auVar86._12_2_ = uVar106;
  auVar86._14_2_ = uVar106;
  uVar106 = (undefined2)(uVar12 >> 0x20);
  auVar85._12_4_ = auVar86._12_4_;
  auVar85._8_2_ = 0;
  auVar85._0_8_ = uVar12;
  auVar85._10_2_ = uVar106;
  auVar84._10_6_ = auVar85._10_6_;
  auVar84._8_2_ = uVar106;
  auVar84._0_8_ = uVar12;
  uVar106 = (undefined2)(uVar12 >> 0x10);
  auVar50._4_8_ = auVar84._8_8_;
  auVar50._2_2_ = uVar106;
  auVar50._0_2_ = uVar106;
  fVar160 = (float)(auVar50._0_4_ >> 0x10);
  fVar216 = (float)(auVar84._8_4_ >> 0x10);
  uVar54 = *(ulong *)(prim + uVar54 * 0x23 + 6);
  uVar106 = (undefined2)(uVar54 >> 0x30);
  auVar309._8_4_ = 0;
  auVar309._0_8_ = uVar54;
  auVar309._12_2_ = uVar106;
  auVar309._14_2_ = uVar106;
  uVar106 = (undefined2)(uVar54 >> 0x20);
  auVar308._12_4_ = auVar309._12_4_;
  auVar308._8_2_ = 0;
  auVar308._0_8_ = uVar54;
  auVar308._10_2_ = uVar106;
  auVar307._10_6_ = auVar308._10_6_;
  auVar307._8_2_ = uVar106;
  auVar307._0_8_ = uVar54;
  uVar106 = (undefined2)(uVar54 >> 0x10);
  auVar51._4_8_ = auVar307._8_8_;
  auVar51._2_2_ = uVar106;
  auVar51._0_2_ = uVar106;
  auVar155._0_8_ =
       CONCAT44(((((float)(auVar41._0_4_ >> 0x10) - fVar136) * fVar283 + fVar136) - fVar325) *
                fVar108,((((float)(int)(short)uVar60 - (float)(int)(short)uVar55) * fVar283 +
                         (float)(int)(short)uVar55) - fVar321) * fVar149);
  auVar155._8_4_ =
       ((((float)(auVar152._8_4_ >> 0x10) - fVar180) * fVar283 + fVar180) - fVar327) * fVar163;
  auVar155._12_4_ =
       ((((float)(auVar153._12_4_ >> 0x10) - (float)(auVar71._12_4_ >> 0x10)) * fVar283 +
        (float)(auVar71._12_4_ >> 0x10)) - fVar328) * fVar219;
  auVar227._0_4_ =
       ((((float)(int)(short)uVar6 - (float)(int)(short)uVar5) * fVar283 + (float)(int)(short)uVar5)
       - fVar321) * fVar149;
  auVar227._4_4_ =
       ((((float)(auVar43._0_4_ >> 0x10) - fVar137) * fVar283 + fVar137) - fVar325) * fVar108;
  auVar227._8_4_ =
       ((((float)(auVar224._8_4_ >> 0x10) - fVar206) * fVar283 + fVar206) - fVar327) * fVar163;
  auVar227._12_4_ =
       ((((float)(auVar225._12_4_ >> 0x10) - (float)(auVar73._12_4_ >> 0x10)) * fVar283 +
        (float)(auVar73._12_4_ >> 0x10)) - fVar328) * fVar219;
  auVar261._0_8_ =
       CONCAT44(((((float)(auVar45._0_4_ >> 0x10) - fVar148) * fVar283 + fVar148) - fVar270) *
                fVar109,((((float)(int)(short)uVar8 - (float)(int)(short)uVar7) * fVar283 +
                         (float)(int)(short)uVar7) - fVar257) * fVar69);
  auVar261._8_4_ =
       ((((float)(auVar258._8_4_ >> 0x10) - fVar207) * fVar283 + fVar207) - fVar271) * fVar175;
  auVar261._12_4_ =
       ((((float)(auVar259._12_4_ >> 0x10) - (float)(auVar76._12_4_ >> 0x10)) * fVar283 +
        (float)(auVar76._12_4_ >> 0x10)) - fVar320) * fVar235;
  auVar277._0_4_ =
       ((((float)(int)(short)uVar9 - (float)(int)(short)uVar58) * fVar283 +
        (float)(int)(short)uVar58) - fVar257) * fVar69;
  auVar277._4_4_ =
       ((((float)(auVar47._0_4_ >> 0x10) - fVar150) * fVar283 + fVar150) - fVar270) * fVar109;
  auVar277._8_4_ =
       ((((float)(auVar274._8_4_ >> 0x10) - fVar210) * fVar283 + fVar210) - fVar271) * fVar175;
  auVar277._12_4_ =
       ((((float)(auVar275._12_4_ >> 0x10) - (float)(auVar79._12_4_ >> 0x10)) * fVar283 +
        (float)(auVar79._12_4_ >> 0x10)) - fVar320) * fVar235;
  uVar14 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar291._0_8_ =
       CONCAT44(((((float)(auVar49._0_4_ >> 0x10) - fVar158) * fVar283 + fVar158) - fVar255) *
                fVar135,((((float)(int)(short)uVar11 - (float)(int)(short)uVar10) * fVar283 +
                         (float)(int)(short)uVar10) - fVar246) * fVar107);
  auVar291._8_4_ =
       ((((float)(auVar288._8_4_ >> 0x10) - fVar214) * fVar283 + fVar214) - fVar256) * fVar177;
  auVar291._12_4_ =
       ((((float)(auVar289._12_4_ >> 0x10) - (float)(auVar82._12_4_ >> 0x10)) * fVar283 +
        (float)(auVar82._12_4_ >> 0x10)) - fVar273) * fVar239;
  auVar310._0_4_ =
       ((((float)(int)(short)uVar54 - (float)(int)(short)uVar12) * fVar283 +
        (float)(int)(short)uVar12) - fVar246) * fVar107;
  auVar310._4_4_ =
       ((((float)(auVar51._0_4_ >> 0x10) - fVar160) * fVar283 + fVar160) - fVar255) * fVar135;
  auVar310._8_4_ =
       ((((float)(auVar307._8_4_ >> 0x10) - fVar216) * fVar283 + fVar216) - fVar256) * fVar177;
  auVar310._12_4_ =
       ((((float)(auVar308._12_4_ >> 0x10) - (float)(auVar85._12_4_ >> 0x10)) * fVar283 +
        (float)(auVar85._12_4_ >> 0x10)) - fVar273) * fVar239;
  auVar138._8_4_ = auVar155._8_4_;
  auVar138._0_8_ = auVar155._0_8_;
  auVar138._12_4_ = auVar155._12_4_;
  auVar139 = minps(auVar138,auVar227);
  auVar119._8_4_ = auVar261._8_4_;
  auVar119._0_8_ = auVar261._0_8_;
  auVar119._12_4_ = auVar261._12_4_;
  auVar70 = minps(auVar119,auVar277);
  auVar139 = maxps(auVar139,auVar70);
  auVar120._8_4_ = auVar291._8_4_;
  auVar120._0_8_ = auVar291._0_8_;
  auVar120._12_4_ = auVar291._12_4_;
  auVar70 = minps(auVar120,auVar310);
  auVar87._4_4_ = uVar14;
  auVar87._0_4_ = uVar14;
  auVar87._8_4_ = uVar14;
  auVar87._12_4_ = uVar14;
  auVar70 = maxps(auVar70,auVar87);
  auVar70 = maxps(auVar139,auVar70);
  auVar139 = maxps(auVar155,auVar227);
  auVar262 = maxps(auVar261,auVar277);
  auVar139 = minps(auVar139,auVar262);
  local_2e8 = auVar70._0_4_ * 0.99999964;
  fStack_2e4 = auVar70._4_4_ * 0.99999964;
  fStack_2e0 = auVar70._8_4_ * 0.99999964;
  fStack_2dc = auVar70._12_4_ * 0.99999964;
  auVar70 = maxps(auVar291,auVar310);
  uVar14 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar88._4_4_ = uVar14;
  auVar88._0_4_ = uVar14;
  auVar88._8_4_ = uVar14;
  auVar88._12_4_ = uVar14;
  auVar70 = minps(auVar70,auVar88);
  auVar70 = minps(auVar139,auVar70);
  uVar62 = (uint)(byte)PVar13;
  auVar121._0_4_ = -(uint)(uVar62 != 0 && local_2e8 <= auVar70._0_4_ * 1.0000004);
  auVar121._4_4_ = -(uint)(1 < uVar62 && fStack_2e4 <= auVar70._4_4_ * 1.0000004);
  auVar121._8_4_ = -(uint)(2 < uVar62 && fStack_2e0 <= auVar70._8_4_ * 1.0000004);
  auVar121._12_4_ = -(uint)(3 < uVar62 && fStack_2dc <= auVar70._12_4_ * 1.0000004);
  uVar62 = movmskps(uVar62,auVar121);
  if (uVar62 == 0) {
    return;
  }
  uVar62 = uVar62 & 0xff;
  local_3a0 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_288._0_4_ = -(uint)((int)mm_lookupmask_ps._240_4_ < 0);
  local_288._4_4_ = -(uint)((int)mm_lookupmask_ps._244_4_ < 0);
  local_288._8_4_ = -(uint)((int)mm_lookupmask_ps._248_4_ < 0);
  local_288._12_4_ = 0;
  local_4f8 = ray;
  local_398 = prim;
LAB_00b127d5:
  lVar20 = 0;
  if ((ulong)uVar62 != 0) {
    for (; (uVar62 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
    }
  }
  uVar64 = *(uint *)(local_398 + 2);
  uVar66 = *(uint *)(local_398 + lVar20 * 4 + 6);
  pGVar15 = (context->scene->geometries).items[uVar64].ptr;
  fVar149 = pGVar15->fnumTimeSegments;
  fVar69 = (pGVar15->time_range).lower;
  fVar107 = ((*(float *)(ray + k * 4 + 0x70) - fVar69) / ((pGVar15->time_range).upper - fVar69)) *
            fVar149;
  fVar69 = floorf(fVar107);
  fVar149 = fVar149 + -1.0;
  if (fVar149 <= fVar69) {
    fVar69 = fVar149;
  }
  fVar149 = 0.0;
  if (0.0 <= fVar69) {
    fVar149 = fVar69;
  }
  uVar55 = (ulong)*(uint *)(*(long *)&pGVar15->field_0x58 +
                           (ulong)uVar66 *
                           pGVar15[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var16 = pGVar15[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar59 = (long)(int)fVar149 * 0x38;
  lVar17 = *(long *)(_Var16 + lVar59);
  lVar18 = *(long *)(_Var16 + 0x10 + lVar59);
  pfVar3 = (float *)(lVar17 + lVar18 * uVar55);
  fVar69 = *pfVar3;
  fVar108 = pfVar3[1];
  fVar109 = pfVar3[2];
  fVar135 = pfVar3[3];
  lVar20 = uVar55 + 1;
  pfVar3 = (float *)(lVar17 + lVar18 * lVar20);
  fVar136 = *pfVar3;
  fVar137 = pfVar3[1];
  fVar148 = pfVar3[2];
  fVar150 = pfVar3[3];
  lVar1 = uVar55 + 2;
  pfVar3 = (float *)(lVar17 + lVar18 * lVar1);
  fVar158 = *pfVar3;
  fVar160 = pfVar3[1];
  fVar163 = pfVar3[2];
  fVar175 = pfVar3[3];
  lVar2 = uVar55 + 3;
  pfVar3 = (float *)(lVar17 + lVar18 * lVar2);
  fVar177 = *pfVar3;
  fVar180 = pfVar3[1];
  fVar206 = pfVar3[2];
  fVar207 = pfVar3[3];
  lVar17 = *(long *)&pGVar15[4].fnumTimeSegments;
  lVar18 = *(long *)(lVar17 + lVar59);
  lVar19 = *(long *)(lVar17 + 0x10 + lVar59);
  pfVar3 = (float *)(lVar18 + lVar19 * uVar55);
  fVar210 = *pfVar3;
  fVar214 = pfVar3[1];
  fVar216 = pfVar3[2];
  fVar219 = pfVar3[3];
  pfVar3 = (float *)(lVar18 + lVar19 * lVar20);
  fVar235 = *pfVar3;
  fVar239 = pfVar3[1];
  fVar257 = pfVar3[2];
  fVar270 = pfVar3[3];
  pfVar3 = (float *)(lVar18 + lVar19 * lVar1);
  fVar271 = *pfVar3;
  fVar320 = pfVar3[1];
  fVar246 = pfVar3[2];
  fVar255 = pfVar3[3];
  fVar107 = fVar107 - fVar149;
  pfVar3 = (float *)(lVar18 + lVar19 * lVar2);
  fVar149 = *pfVar3;
  fVar256 = pfVar3[1];
  fVar273 = pfVar3[2];
  fVar283 = pfVar3[3];
  fVar284 = fVar69 * 0.16666667 + fVar136 * 0.6666667 + fVar158 * 0.16666667 + fVar177 * 0.0;
  fVar297 = fVar108 * 0.16666667 + fVar137 * 0.6666667 + fVar160 * 0.16666667 + fVar180 * 0.0;
  fVar301 = fVar109 * 0.16666667 + fVar148 * 0.6666667 + fVar163 * 0.16666667 + fVar206 * 0.0;
  fVar314 = fVar135 * 0.16666667 + fVar150 * 0.6666667 + fVar175 * 0.16666667 + fVar207 * 0.0;
  fVar328 = ((fVar158 * 0.5 + fVar177 * 0.0) - fVar136 * 0.0) - fVar69 * 0.5;
  fVar159 = ((fVar160 * 0.5 + fVar180 * 0.0) - fVar137 * 0.0) - fVar108 * 0.5;
  fVar161 = ((fVar163 * 0.5 + fVar206 * 0.0) - fVar148 * 0.0) - fVar109 * 0.5;
  fVar162 = ((fVar175 * 0.5 + fVar207 * 0.0) - fVar150 * 0.0) - fVar135 * 0.5;
  fVar316 = fVar210 * 0.16666667 + fVar235 * 0.6666667 + fVar271 * 0.16666667 + fVar149 * 0.0;
  fVar315 = fVar214 * 0.16666667 + fVar239 * 0.6666667 + fVar320 * 0.16666667 + fVar256 * 0.0;
  fVar317 = fVar216 * 0.16666667 + fVar257 * 0.6666667 + fVar246 * 0.16666667 + fVar273 * 0.0;
  fVar319 = fVar219 * 0.16666667 + fVar270 * 0.6666667 + fVar255 * 0.16666667 + fVar283 * 0.0;
  fVar285 = ((fVar271 * 0.5 + fVar149 * 0.0) - fVar235 * 0.0) - fVar210 * 0.5;
  fVar299 = ((fVar320 * 0.5 + fVar256 * 0.0) - fVar239 * 0.0) - fVar214 * 0.5;
  fVar304 = ((fVar246 * 0.5 + fVar273 * 0.0) - fVar257 * 0.0) - fVar216 * 0.5;
  fVar302 = ((fVar255 * 0.5 + fVar283 * 0.0) - fVar270 * 0.0) - fVar219 * 0.5;
  fVar164 = fVar136 * 0.16666667 + fVar158 * 0.6666667 + fVar177 * 0.16666667 + fVar69 * 0.0;
  fVar176 = fVar137 * 0.16666667 + fVar160 * 0.6666667 + fVar180 * 0.16666667 + fVar108 * 0.0;
  fVar178 = fVar148 * 0.16666667 + fVar163 * 0.6666667 + fVar206 * 0.16666667 + fVar109 * 0.0;
  fVar179 = fVar150 * 0.16666667 + fVar175 * 0.6666667 + fVar207 * 0.16666667 + fVar135 * 0.0;
  fVar318 = ((fVar158 * 0.0 + fVar177 * 0.5) - fVar136 * 0.5) - fVar69 * 0.0;
  fVar321 = ((fVar160 * 0.0 + fVar180 * 0.5) - fVar137 * 0.5) - fVar108 * 0.0;
  fVar325 = ((fVar163 * 0.0 + fVar206 * 0.5) - fVar148 * 0.5) - fVar109 * 0.0;
  fVar327 = ((fVar175 * 0.0 + fVar207 * 0.5) - fVar150 * 0.5) - fVar135 * 0.0;
  fVar109 = fVar235 * 0.16666667 + fVar271 * 0.6666667 + fVar149 * 0.16666667 + fVar210 * 0.0;
  fVar135 = fVar239 * 0.16666667 + fVar320 * 0.6666667 + fVar256 * 0.16666667 + fVar214 * 0.0;
  fVar136 = fVar257 * 0.16666667 + fVar246 * 0.6666667 + fVar273 * 0.16666667 + fVar216 * 0.0;
  fVar137 = fVar270 * 0.16666667 + fVar255 * 0.6666667 + fVar283 * 0.16666667 + fVar219 * 0.0;
  fVar149 = ((fVar271 * 0.0 + fVar149 * 0.5) - fVar235 * 0.5) - fVar210 * 0.0;
  fVar69 = ((fVar320 * 0.0 + fVar256 * 0.5) - fVar239 * 0.5) - fVar214 * 0.0;
  fVar108 = ((fVar246 * 0.0 + fVar273 * 0.5) - fVar257 * 0.5) - fVar216 * 0.0;
  fVar210 = ((fVar255 * 0.0 + fVar283 * 0.5) - fVar270 * 0.5) - fVar219 * 0.0;
  fVar322 = fVar159 * fVar316 - fVar315 * fVar328;
  fVar326 = fVar161 * fVar315 - fVar317 * fVar159;
  fVar317 = fVar328 * fVar317 - fVar316 * fVar161;
  fVar329 = fVar162 * fVar319 - fVar319 * fVar162;
  fVar219 = fVar159 * fVar285 - fVar299 * fVar328;
  fVar239 = fVar161 * fVar299 - fVar304 * fVar159;
  fVar257 = fVar328 * fVar304 - fVar285 * fVar161;
  fVar246 = fVar321 * fVar109 - fVar135 * fVar318;
  fVar255 = fVar325 * fVar135 - fVar136 * fVar321;
  fVar256 = fVar318 * fVar136 - fVar109 * fVar325;
  fVar273 = fVar327 * fVar137 - fVar137 * fVar327;
  fVar270 = fVar321 * fVar149 - fVar69 * fVar318;
  fVar271 = fVar325 * fVar69 - fVar108 * fVar321;
  fVar320 = fVar318 * fVar108 - fVar149 * fVar325;
  fVar207 = fVar317 * fVar317 + fVar326 * fVar326 + fVar322 * fVar322;
  auVar70 = ZEXT416((uint)fVar207);
  auVar139 = rsqrtss(ZEXT416((uint)fVar207),auVar70);
  fVar149 = auVar139._0_4_;
  fVar283 = fVar149 * 1.5 - fVar149 * fVar149 * fVar207 * 0.5 * fVar149;
  fVar315 = fVar322 * fVar219 + fVar317 * fVar257 + fVar326 * fVar239;
  fVar216 = fVar329 * fVar283;
  auVar70 = rcpss(auVar70,auVar70);
  fVar235 = (2.0 - fVar207 * auVar70._0_4_) * auVar70._0_4_;
  fVar305 = fVar256 * fVar256 + fVar255 * fVar255 + fVar246 * fVar246;
  auVar139 = ZEXT416((uint)fVar305);
  auVar70 = rsqrtss(ZEXT416((uint)fVar305),auVar139);
  fVar149 = auVar70._0_4_;
  fVar319 = fVar149 * 1.5 - fVar149 * fVar149 * fVar305 * 0.5 * fVar149;
  fVar330 = fVar246 * fVar270 + fVar256 * fVar320 + fVar255 * fVar271;
  lVar18 = *(long *)(_Var16 + 0x38 + lVar59);
  lVar19 = *(long *)(_Var16 + 0x48 + lVar59);
  pfVar3 = (float *)(lVar18 + lVar19 * uVar55);
  fVar149 = *pfVar3;
  fVar69 = pfVar3[1];
  fVar108 = pfVar3[2];
  fVar109 = pfVar3[3];
  pfVar3 = (float *)(lVar18 + lVar19 * lVar20);
  fVar135 = *pfVar3;
  fVar136 = pfVar3[1];
  fVar137 = pfVar3[2];
  fVar148 = pfVar3[3];
  pfVar3 = (float *)(lVar18 + lVar19 * lVar1);
  fVar150 = *pfVar3;
  fVar158 = pfVar3[1];
  fVar160 = pfVar3[2];
  fVar163 = pfVar3[3];
  auVar70 = rcpss(auVar139,auVar139);
  pfVar3 = (float *)(lVar18 + lVar19 * lVar2);
  fVar175 = *pfVar3;
  fVar177 = pfVar3[1];
  fVar180 = pfVar3[2];
  fVar206 = pfVar3[3];
  lVar18 = *(long *)(lVar17 + 0x38 + lVar59);
  lVar17 = *(long *)(lVar17 + 0x48 + lVar59);
  fVar214 = fVar273 * fVar319;
  fVar331 = (2.0 - fVar305 * auVar70._0_4_) * auVar70._0_4_;
  fVar285 = fVar314 * fVar326 * fVar283;
  fVar299 = fVar314 * fVar317 * fVar283;
  fVar304 = fVar314 * fVar322 * fVar283;
  fVar316 = fVar314 * fVar216;
  fVar211 = fVar284 - fVar285;
  fVar215 = fVar297 - fVar299;
  fVar217 = fVar301 - fVar304;
  fVar218 = fVar314 - fVar316;
  fVar286 = fVar314 * fVar235 * (fVar207 * fVar239 - fVar315 * fVar326) * fVar283 +
            fVar162 * fVar326 * fVar283;
  fVar298 = fVar314 * fVar235 * (fVar207 * fVar257 - fVar315 * fVar317) * fVar283 +
            fVar162 * fVar317 * fVar283;
  fVar300 = fVar314 * fVar235 * (fVar207 * fVar219 - fVar315 * fVar322) * fVar283 +
            fVar162 * fVar322 * fVar283;
  fVar303 = fVar314 * fVar235 * (fVar207 * (fVar162 * fVar302 - fVar302 * fVar162) -
                                fVar315 * fVar329) * fVar283 + fVar162 * fVar216;
  fVar285 = fVar285 + fVar284;
  fVar299 = fVar299 + fVar297;
  fVar304 = fVar304 + fVar301;
  fVar316 = fVar316 + fVar314;
  fVar284 = fVar179 * fVar255 * fVar319;
  fVar297 = fVar179 * fVar256 * fVar319;
  fVar301 = fVar179 * fVar246 * fVar319;
  fVar314 = fVar179 * fVar214;
  fVar220 = fVar164 - fVar284;
  fVar236 = fVar176 - fVar297;
  fVar240 = fVar178 - fVar301;
  fVar243 = fVar179 - fVar314;
  fVar302 = fVar179 * fVar331 * (fVar305 * fVar271 - fVar330 * fVar255) * fVar319 +
            fVar327 * fVar255 * fVar319;
  fVar315 = fVar179 * fVar331 * (fVar305 * fVar320 - fVar330 * fVar256) * fVar319 +
            fVar327 * fVar256 * fVar319;
  fVar317 = fVar179 * fVar331 * (fVar305 * fVar270 - fVar330 * fVar246) * fVar319 +
            fVar327 * fVar246 * fVar319;
  fVar319 = fVar179 * fVar331 * (fVar305 * (fVar327 * fVar210 - fVar210 * fVar327) -
                                fVar330 * fVar273) * fVar319 + fVar327 * fVar214;
  fVar284 = fVar284 + fVar164;
  fVar297 = fVar297 + fVar176;
  fVar301 = fVar301 + fVar178;
  fVar314 = fVar314 + fVar179;
  fVar221 = fVar149 * 0.16666667 + fVar135 * 0.6666667 + fVar150 * 0.16666667 + fVar175 * 0.0;
  fVar237 = fVar69 * 0.16666667 + fVar136 * 0.6666667 + fVar158 * 0.16666667 + fVar177 * 0.0;
  fVar241 = fVar108 * 0.16666667 + fVar137 * 0.6666667 + fVar160 * 0.16666667 + fVar180 * 0.0;
  fVar244 = fVar109 * 0.16666667 + fVar148 * 0.6666667 + fVar163 * 0.16666667 + fVar206 * 0.0;
  fVar164 = ((fVar150 * 0.5 + fVar175 * 0.0) - fVar135 * 0.0) - fVar149 * 0.5;
  fVar176 = ((fVar158 * 0.5 + fVar177 * 0.0) - fVar136 * 0.0) - fVar69 * 0.5;
  fVar178 = ((fVar160 * 0.5 + fVar180 * 0.0) - fVar137 * 0.0) - fVar108 * 0.5;
  fVar179 = ((fVar163 * 0.5 + fVar206 * 0.0) - fVar148 * 0.0) - fVar109 * 0.5;
  pfVar3 = (float *)(lVar18 + lVar17 * lVar2);
  fVar207 = *pfVar3;
  fVar210 = pfVar3[1];
  fVar214 = pfVar3[2];
  fVar216 = pfVar3[3];
  pfVar3 = (float *)(lVar18 + lVar1 * lVar17);
  fVar219 = *pfVar3;
  fVar235 = pfVar3[1];
  fVar239 = pfVar3[2];
  fVar257 = pfVar3[3];
  pfVar3 = (float *)(lVar18 + lVar20 * lVar17);
  fVar270 = *pfVar3;
  fVar271 = pfVar3[1];
  fVar320 = pfVar3[2];
  fVar246 = pfVar3[3];
  pfVar3 = (float *)(lVar18 + uVar55 * lVar17);
  fVar255 = *pfVar3;
  fVar256 = pfVar3[1];
  fVar273 = pfVar3[2];
  fVar283 = pfVar3[3];
  fVar222 = fVar255 * 0.16666667 + fVar270 * 0.6666667 + fVar219 * 0.16666667 + fVar207 * 0.0;
  fVar238 = fVar256 * 0.16666667 + fVar271 * 0.6666667 + fVar235 * 0.16666667 + fVar210 * 0.0;
  fVar242 = fVar273 * 0.16666667 + fVar320 * 0.6666667 + fVar239 * 0.16666667 + fVar214 * 0.0;
  fVar245 = fVar283 * 0.16666667 + fVar246 * 0.6666667 + fVar257 * 0.16666667 + fVar216 * 0.0;
  fVar330 = ((fVar219 * 0.5 + fVar207 * 0.0) - fVar270 * 0.0) - fVar255 * 0.5;
  fVar331 = ((fVar235 * 0.5 + fVar210 * 0.0) - fVar271 * 0.0) - fVar256 * 0.5;
  fVar208 = ((fVar239 * 0.5 + fVar214 * 0.0) - fVar320 * 0.0) - fVar273 * 0.5;
  fVar209 = ((fVar257 * 0.5 + fVar216 * 0.0) - fVar246 * 0.0) - fVar283 * 0.5;
  fVar305 = fVar135 * 0.16666667 + fVar150 * 0.6666667 + fVar175 * 0.16666667 + fVar149 * 0.0;
  fVar322 = fVar136 * 0.16666667 + fVar158 * 0.6666667 + fVar177 * 0.16666667 + fVar69 * 0.0;
  fVar326 = fVar137 * 0.16666667 + fVar160 * 0.6666667 + fVar180 * 0.16666667 + fVar108 * 0.0;
  fVar329 = fVar148 * 0.16666667 + fVar163 * 0.6666667 + fVar206 * 0.16666667 + fVar109 * 0.0;
  fVar135 = ((fVar150 * 0.0 + fVar175 * 0.5) - fVar135 * 0.5) - fVar149 * 0.0;
  fVar150 = ((fVar158 * 0.0 + fVar177 * 0.5) - fVar136 * 0.5) - fVar69 * 0.0;
  fVar160 = ((fVar160 * 0.0 + fVar180 * 0.5) - fVar137 * 0.5) - fVar108 * 0.0;
  fVar175 = ((fVar163 * 0.0 + fVar206 * 0.5) - fVar148 * 0.5) - fVar109 * 0.0;
  fVar136 = fVar270 * 0.16666667 + fVar219 * 0.6666667 + fVar207 * 0.16666667 + fVar255 * 0.0;
  fVar137 = fVar271 * 0.16666667 + fVar235 * 0.6666667 + fVar210 * 0.16666667 + fVar256 * 0.0;
  fVar148 = fVar320 * 0.16666667 + fVar239 * 0.6666667 + fVar214 * 0.16666667 + fVar273 * 0.0;
  fVar272 = fVar246 * 0.16666667 + fVar257 * 0.6666667 + fVar216 * 0.16666667 + fVar283 * 0.0;
  fVar149 = ((fVar219 * 0.0 + fVar207 * 0.5) - fVar270 * 0.5) - fVar255 * 0.0;
  fVar69 = ((fVar235 * 0.0 + fVar210 * 0.5) - fVar271 * 0.5) - fVar256 * 0.0;
  fVar108 = ((fVar239 * 0.0 + fVar214 * 0.5) - fVar320 * 0.5) - fVar273 * 0.0;
  fVar158 = ((fVar257 * 0.0 + fVar216 * 0.5) - fVar246 * 0.5) - fVar283 * 0.0;
  fVar216 = fVar176 * fVar222 - fVar238 * fVar164;
  fVar210 = fVar178 * fVar238 - fVar242 * fVar176;
  fVar214 = fVar164 * fVar242 - fVar222 * fVar178;
  fVar219 = fVar179 * fVar245 - fVar245 * fVar179;
  fVar109 = fVar176 * fVar330 - fVar331 * fVar164;
  fVar177 = fVar178 * fVar331 - fVar208 * fVar176;
  fVar206 = fVar164 * fVar208 - fVar330 * fVar178;
  fVar163 = fVar150 * fVar136 - fVar137 * fVar135;
  fVar180 = fVar160 * fVar137 - fVar148 * fVar150;
  fVar207 = fVar135 * fVar148 - fVar136 * fVar160;
  fVar320 = fVar175 * fVar272 - fVar272 * fVar175;
  fVar136 = fVar150 * fVar149 - fVar69 * fVar135;
  fVar137 = fVar160 * fVar69 - fVar108 * fVar150;
  fVar148 = fVar135 * fVar108 - fVar149 * fVar160;
  fVar149 = fVar214 * fVar214 + fVar210 * fVar210 + fVar216 * fVar216;
  auVar70 = ZEXT416((uint)fVar149);
  auVar139 = rsqrtss(ZEXT416((uint)fVar149),auVar70);
  fVar69 = auVar139._0_4_;
  fVar271 = fVar69 * 1.5 - fVar69 * fVar69 * fVar149 * 0.5 * fVar69;
  fVar246 = fVar216 * fVar109 + fVar214 * fVar206 + fVar210 * fVar177;
  auVar70 = rcpss(auVar70,auVar70);
  fVar69 = (2.0 - fVar149 * auVar70._0_4_) * auVar70._0_4_;
  fVar108 = fVar219 * fVar271;
  fVar255 = fVar207 * fVar207 + fVar180 * fVar180 + fVar163 * fVar163;
  auVar70 = ZEXT416((uint)fVar255);
  auVar139 = rsqrtss(ZEXT416((uint)fVar255),auVar70);
  fVar235 = auVar139._0_4_;
  fVar273 = fVar235 * 1.5 - fVar235 * fVar235 * fVar255 * 0.5 * fVar235;
  fVar208 = fVar163 * fVar136 + fVar207 * fVar148 + fVar180 * fVar137;
  auVar70 = rcpss(auVar70,auVar70);
  fVar222 = (2.0 - fVar255 * auVar70._0_4_) * auVar70._0_4_;
  fVar256 = fVar320 * fVar273;
  fVar235 = fVar244 * fVar210 * fVar271;
  fVar239 = fVar244 * fVar214 * fVar271;
  fVar257 = fVar244 * fVar216 * fVar271;
  fVar270 = fVar244 * fVar108;
  fVar210 = fVar244 * fVar69 * (fVar149 * fVar177 - fVar246 * fVar210) * fVar271 +
            fVar179 * fVar210 * fVar271;
  fVar214 = fVar244 * fVar69 * (fVar149 * fVar206 - fVar246 * fVar214) * fVar271 +
            fVar179 * fVar214 * fVar271;
  fVar216 = fVar244 * fVar69 * (fVar149 * fVar109 - fVar246 * fVar216) * fVar271 +
            fVar179 * fVar216 * fVar271;
  fVar219 = fVar244 * fVar69 * (fVar149 * (fVar179 * fVar209 - fVar209 * fVar179) -
                               fVar246 * fVar219) * fVar271 + fVar179 * fVar108;
  fVar177 = fVar221 - fVar235;
  fVar206 = fVar237 - fVar239;
  fVar271 = fVar241 - fVar257;
  fVar246 = fVar244 - fVar270;
  fVar235 = fVar235 + fVar221;
  fVar239 = fVar239 + fVar237;
  fVar257 = fVar257 + fVar241;
  fVar270 = fVar270 + fVar244;
  fVar149 = fVar329 * fVar180 * fVar273;
  fVar69 = fVar329 * fVar207 * fVar273;
  fVar108 = fVar329 * fVar163 * fVar273;
  fVar109 = fVar329 * fVar256;
  fVar283 = fVar329 * fVar222 * (fVar255 * fVar137 - fVar208 * fVar180) * fVar273 +
            fVar175 * fVar180 * fVar273;
  fVar330 = fVar329 * fVar222 * (fVar255 * fVar148 - fVar208 * fVar207) * fVar273 +
            fVar175 * fVar207 * fVar273;
  fVar331 = fVar329 * fVar222 * (fVar255 * fVar136 - fVar208 * fVar163) * fVar273 +
            fVar175 * fVar163 * fVar273;
  fVar208 = fVar329 * fVar222 * (fVar255 * (fVar175 * fVar158 - fVar158 * fVar175) -
                                fVar208 * fVar320) * fVar273 + fVar175 * fVar256;
  fVar136 = fVar305 - fVar149;
  fVar137 = fVar322 - fVar69;
  fVar148 = fVar326 - fVar108;
  fVar158 = fVar329 - fVar109;
  fVar149 = fVar149 + fVar305;
  fVar69 = fVar69 + fVar322;
  fVar108 = fVar108 + fVar326;
  fVar109 = fVar109 + fVar329;
  fVar305 = 1.0 - fVar107;
  fVar322 = fVar211 * fVar305 + fVar177 * fVar107;
  fVar326 = fVar215 * fVar305 + fVar206 * fVar107;
  fVar329 = fVar217 * fVar305 + fVar271 * fVar107;
  fVar209 = fVar218 * fVar305 + fVar246 * fVar107;
  fVar211 = ((fVar328 - fVar286) * 0.33333334 + fVar211) * fVar305 +
            ((fVar164 - fVar210) * 0.33333334 + fVar177) * fVar107;
  fVar215 = ((fVar159 - fVar298) * 0.33333334 + fVar215) * fVar305 +
            ((fVar176 - fVar214) * 0.33333334 + fVar206) * fVar107;
  fVar217 = ((fVar161 - fVar300) * 0.33333334 + fVar217) * fVar305 +
            ((fVar178 - fVar216) * 0.33333334 + fVar271) * fVar107;
  fVar218 = ((fVar162 - fVar303) * 0.33333334 + fVar218) * fVar305 +
            ((fVar179 - fVar219) * 0.33333334 + fVar246) * fVar107;
  fVar271 = (fVar220 - (fVar318 - fVar302) * 0.33333334) * fVar305 +
            (fVar136 - (fVar135 - fVar283) * 0.33333334) * fVar107;
  fVar320 = (fVar236 - (fVar321 - fVar315) * 0.33333334) * fVar305 +
            (fVar137 - (fVar150 - fVar330) * 0.33333334) * fVar107;
  fVar246 = (fVar240 - (fVar325 - fVar317) * 0.33333334) * fVar305 +
            (fVar148 - (fVar160 - fVar331) * 0.33333334) * fVar107;
  fVar255 = (fVar243 - (fVar327 - fVar319) * 0.33333334) * fVar305 +
            (fVar158 - (fVar175 - fVar208) * 0.33333334) * fVar107;
  fVar177 = fVar220 * fVar305 + fVar136 * fVar107;
  fVar180 = fVar236 * fVar305 + fVar137 * fVar107;
  fVar206 = fVar240 * fVar305 + fVar148 * fVar107;
  fVar207 = fVar243 * fVar305 + fVar158 * fVar107;
  fVar136 = fVar285 * fVar305 + fVar235 * fVar107;
  fVar148 = fVar299 * fVar305 + fVar239 * fVar107;
  fVar158 = fVar304 * fVar305 + fVar257 * fVar107;
  fVar163 = fVar316 * fVar305 + fVar270 * fVar107;
  fVar256 = ((fVar286 + fVar328) * 0.33333334 + fVar285) * fVar305 +
            ((fVar210 + fVar164) * 0.33333334 + fVar235) * fVar107;
  fVar273 = ((fVar298 + fVar159) * 0.33333334 + fVar299) * fVar305 +
            ((fVar214 + fVar176) * 0.33333334 + fVar239) * fVar107;
  fVar257 = ((fVar300 + fVar161) * 0.33333334 + fVar304) * fVar305 +
            ((fVar216 + fVar178) * 0.33333334 + fVar257) * fVar107;
  fVar270 = ((fVar303 + fVar162) * 0.33333334 + fVar316) * fVar305 +
            ((fVar219 + fVar179) * 0.33333334 + fVar270) * fVar107;
  fVar137 = (fVar284 - (fVar302 + fVar318) * 0.33333334) * fVar305 +
            (fVar149 - (fVar283 + fVar135) * 0.33333334) * fVar107;
  fVar150 = (fVar297 - (fVar315 + fVar321) * 0.33333334) * fVar305 +
            (fVar69 - (fVar330 + fVar150) * 0.33333334) * fVar107;
  fVar160 = (fVar301 - (fVar317 + fVar325) * 0.33333334) * fVar305 +
            (fVar108 - (fVar331 + fVar160) * 0.33333334) * fVar107;
  fVar175 = (fVar314 - (fVar319 + fVar327) * 0.33333334) * fVar305 +
            (fVar109 - (fVar208 + fVar175) * 0.33333334) * fVar107;
  local_298 = fVar305 * fVar284 + fVar107 * fVar149;
  fStack_294 = fVar305 * fVar297 + fVar107 * fVar69;
  fStack_290 = fVar305 * fVar301 + fVar107 * fVar108;
  fStack_28c = fVar305 * fVar314 + fVar107 * fVar109;
  local_1d8 = *(float *)(local_4f8 + k * 4);
  fStack_1d4 = *(float *)(local_4f8 + k * 4 + 0x10);
  fStack_1d0 = *(float *)(local_4f8 + k * 4 + 0x20);
  local_168 = fVar322 - local_1d8;
  fStack_164 = fVar326 - fStack_1d4;
  fStack_160 = fVar329 - fStack_1d0;
  fStack_15c = fVar209 - 0.0;
  fVar149 = pre->ray_space[k].vx.field_0.m128[0];
  fVar69 = pre->ray_space[k].vx.field_0.m128[1];
  fVar107 = pre->ray_space[k].vy.field_0.m128[0];
  fVar108 = pre->ray_space[k].vy.field_0.m128[1];
  fVar109 = pre->ray_space[k].vz.field_0.m128[0];
  fVar135 = pre->ray_space[k].vz.field_0.m128[1];
  fVar283 = local_168 * fVar149 + fStack_164 * fVar107 + fStack_160 * fVar109;
  fVar284 = local_168 * fVar69 + fStack_164 * fVar108 + fStack_160 * fVar135;
  auVar89._4_4_ = fVar284;
  auVar89._0_4_ = fVar283;
  local_178 = fVar211 - local_1d8;
  fStack_174 = fVar215 - fStack_1d4;
  fStack_170 = fVar217 - fStack_1d0;
  fStack_16c = fVar218 - 0.0;
  fVar304 = local_178 * fVar149 + fStack_174 * fVar107 + fStack_170 * fVar109;
  fVar314 = local_178 * fVar69 + fStack_174 * fVar108 + fStack_170 * fVar135;
  auVar292._4_4_ = fVar314;
  auVar292._0_4_ = fVar304;
  local_188 = fVar271 - local_1d8;
  fStack_184 = fVar320 - fStack_1d4;
  fStack_180 = fVar246 - fStack_1d0;
  fStack_17c = fVar255 - 0.0;
  fVar235 = local_188 * fVar149 + fStack_184 * fVar107 + fStack_180 * fVar109;
  fVar239 = local_188 * fVar69 + fStack_184 * fVar108 + fStack_180 * fVar135;
  auVar122._4_4_ = fVar239;
  auVar122._0_4_ = fVar235;
  local_198 = fVar177 - local_1d8;
  fStack_194 = fVar180 - fStack_1d4;
  fStack_190 = fVar206 - fStack_1d0;
  fStack_18c = fVar207 - 0.0;
  fVar216 = local_198 * fVar149 + fStack_194 * fVar107 + fStack_190 * fVar109;
  fVar219 = local_198 * fVar69 + fStack_194 * fVar108 + fStack_190 * fVar135;
  local_118._4_4_ = fVar219;
  local_118._0_4_ = fVar216;
  local_1a8 = fVar136 - local_1d8;
  fStack_1a4 = fVar148 - fStack_1d4;
  fStack_1a0 = fVar158 - fStack_1d0;
  fStack_19c = fVar163 - 0.0;
  fVar285 = local_1a8 * fVar149 + fStack_1a4 * fVar107 + fStack_1a0 * fVar109;
  fVar297 = local_1a8 * fVar69 + fStack_1a4 * fVar108 + fStack_1a0 * fVar135;
  local_1b8 = fVar256 - local_1d8;
  fStack_1b4 = fVar273 - fStack_1d4;
  fStack_1b0 = fVar257 - fStack_1d0;
  fStack_1ac = fVar270 - 0.0;
  fVar299 = local_1b8 * fVar149 + fStack_1b4 * fVar107 + fStack_1b0 * fVar109;
  fVar301 = local_1b8 * fVar69 + fStack_1b4 * fVar108 + fStack_1b0 * fVar135;
  auVar292._12_4_ = fVar301;
  auVar292._8_4_ = fVar299;
  local_1c8 = fVar137 - local_1d8;
  fStack_1c4 = fVar150 - fStack_1d4;
  fStack_1c0 = fVar160 - fStack_1d0;
  fStack_1bc = fVar175 - 0.0;
  fVar210 = local_1c8 * fVar149 + fStack_1c4 * fVar107 + fStack_1c0 * fVar109;
  fVar214 = local_1c8 * fVar69 + fStack_1c4 * fVar108 + fStack_1c0 * fVar135;
  local_1d8 = local_298 - local_1d8;
  fStack_1d4 = fStack_294 - fStack_1d4;
  fStack_1d0 = fStack_290 - fStack_1d0;
  fStack_1cc = fStack_28c - 0.0;
  fVar149 = local_1d8 * fVar149 + fStack_1d4 * fVar107 + fStack_1d0 * fVar109;
  fVar69 = local_1d8 * fVar69 + fStack_1d4 * fVar108 + fStack_1d0 * fVar135;
  fStack_10c = fVar69;
  fStack_110 = fVar149;
  auVar89._8_4_ = fVar285;
  auVar89._12_4_ = fVar297;
  auVar70 = minps(auVar89,auVar292);
  auVar122._8_4_ = fVar210;
  auVar122._12_4_ = fVar214;
  auVar139 = minps(auVar122,_local_118);
  auVar70 = minps(auVar70,auVar139);
  auVar123._4_4_ = fVar284;
  auVar123._0_4_ = fVar283;
  auVar123._8_4_ = fVar285;
  auVar123._12_4_ = fVar297;
  auVar139 = maxps(auVar123,auVar292);
  auVar140._4_4_ = fVar239;
  auVar140._0_4_ = fVar235;
  auVar140._8_4_ = fVar210;
  auVar140._12_4_ = fVar214;
  auVar141 = maxps(auVar140,_local_118);
  auVar262 = maxps(auVar139,auVar141);
  auVar21._4_8_ = auVar141._8_8_;
  auVar21._0_4_ = auVar70._4_4_;
  auVar142._0_8_ = auVar21._0_8_ << 0x20;
  auVar142._8_4_ = auVar70._8_4_;
  auVar142._12_4_ = auVar70._12_4_;
  auVar143._8_8_ = auVar70._8_8_;
  auVar143._0_8_ = auVar142._8_8_;
  auVar139 = minps(auVar70,auVar143);
  auVar22._4_8_ = auVar70._8_8_;
  auVar22._0_4_ = auVar262._4_4_;
  auVar144._0_8_ = auVar22._0_8_ << 0x20;
  auVar144._8_4_ = auVar262._8_4_;
  auVar144._12_4_ = auVar262._12_4_;
  auVar145._8_8_ = auVar262._8_8_;
  auVar145._0_8_ = auVar144._8_8_;
  auVar70 = maxps(auVar262,auVar145);
  auVar90._0_8_ = auVar139._0_8_ & 0x7fffffff7fffffff;
  auVar90._8_4_ = auVar139._8_4_ & 0x7fffffff;
  auVar90._12_4_ = auVar139._12_4_ & 0x7fffffff;
  auVar124._0_8_ = auVar70._0_8_ & 0x7fffffff7fffffff;
  auVar124._8_4_ = auVar70._8_4_ & 0x7fffffff;
  auVar124._12_4_ = auVar70._12_4_ & 0x7fffffff;
  auVar70 = maxps(auVar90,auVar124);
  fStack_124 = auVar70._4_4_;
  local_128 = fStack_124;
  if (fStack_124 <= auVar70._0_4_) {
    local_128 = auVar70._0_4_;
  }
  uVar55 = (ulong)uVar62 + 0xf;
  local_128 = local_128 * 9.536743e-07;
  fStack_120 = fStack_124;
  fStack_11c = fStack_124;
  local_268 = local_128;
  fStack_264 = local_128;
  fStack_260 = local_128;
  fStack_25c = local_128;
  local_278 = -local_128;
  fStack_274 = -local_128;
  fStack_270 = -local_128;
  fStack_26c = -local_128;
  local_138 = fVar304 - fVar283;
  fStack_134 = fVar314 - fVar284;
  fStack_130 = fVar299 - fVar285;
  fStack_12c = fVar301 - fVar297;
  local_148 = fVar235 - fVar304;
  fStack_144 = fVar239 - fVar314;
  fStack_140 = fVar210 - fVar299;
  fStack_13c = fVar214 - fVar301;
  local_158 = fVar216 - fVar235;
  fStack_154 = fVar219 - fVar239;
  fStack_150 = fVar149 - fVar210;
  fStack_14c = fVar69 - fVar214;
  local_2a8 = fVar136 - fVar322;
  fStack_2a4 = fVar148 - fVar326;
  fStack_2a0 = fVar158 - fVar329;
  fStack_29c = fVar163 - fVar209;
  local_2b8 = fVar256 - fVar211;
  fStack_2b4 = fVar273 - fVar215;
  fStack_2b0 = fVar257 - fVar217;
  fStack_2ac = fVar270 - fVar218;
  local_2c8 = fVar137 - fVar271;
  fStack_2c4 = fVar150 - fVar320;
  fStack_2c0 = fVar160 - fVar246;
  fStack_2bc = fVar175 - fVar255;
  local_2d8 = local_298 - fVar177;
  fStack_2d4 = fStack_294 - fVar180;
  fStack_2d0 = fStack_290 - fVar206;
  fStack_2cc = fStack_28c - fVar207;
  local_2f8 = uVar64;
  uStack_2f4 = uVar64;
  uStack_2f0 = uVar64;
  uStack_2ec = uVar64;
  local_308 = uVar66;
  uStack_304 = uVar66;
  uStack_300 = uVar66;
  uStack_2fc = uVar66;
  uVar60 = 0;
  fVar107 = *(float *)(local_4f8 + k * 4 + 0x30);
  fVar108 = 0.0;
  fVar109 = 1.0;
  fVar135 = 0.0;
  fVar163 = 1.0;
  ray = local_4f8;
  local_390 = uVar55;
LAB_00b1364d:
  do {
    fVar175 = 1.0 - fVar108;
    fVar207 = 1.0 - fVar108;
    fVar270 = 1.0 - fVar109;
    fVar255 = 1.0 - fVar109;
    fVar317 = fVar283 * fVar175 + fVar285 * fVar108;
    fVar330 = fVar284 * fVar207 + fVar297 * fVar108;
    fVar331 = fVar283 * fVar270 + fVar285 * fVar109;
    fVar208 = fVar284 * fVar255 + fVar297 * fVar109;
    fVar321 = fVar304 * fVar175 + fVar299 * fVar108;
    fVar319 = fVar314 * fVar207 + fVar301 * fVar108;
    fVar179 = fVar304 * fVar270 + fVar299 * fVar109;
    fVar305 = fVar314 * fVar255 + fVar301 * fVar109;
    fVar221 = fVar235 * fVar175 + fVar210 * fVar108;
    fVar222 = fVar239 * fVar207 + fVar214 * fVar108;
    fVar286 = fVar235 * fVar270 + fVar210 * fVar109;
    fVar298 = fVar239 * fVar255 + fVar214 * fVar109;
    fVar209 = fVar175 * fVar216 + fVar108 * fVar149;
    fVar218 = fVar207 * fVar219 + fVar108 * fVar69;
    fVar220 = fVar270 * fVar216 + fVar109 * fVar149;
    fVar238 = fVar255 * fVar219 + fVar109 * fVar69;
    fVar240 = (fVar163 - fVar135) * 0.11111111;
    fVar242 = (fVar163 - fVar135) * 0.0 + fVar135;
    fVar243 = (fVar163 - fVar135) * 0.33333334 + fVar135;
    fVar245 = (fVar163 - fVar135) * 0.6666667 + fVar135;
    fVar272 = (fVar163 - fVar135) * 1.0 + fVar135;
    fVar207 = 1.0 - fVar242;
    fVar255 = 1.0 - fVar243;
    fVar318 = 1.0 - fVar245;
    fVar325 = 1.0 - fVar272;
    fVar327 = fVar321 * fVar207 + fVar221 * fVar242;
    fVar328 = fVar321 * fVar255 + fVar221 * fVar243;
    fVar302 = fVar321 * fVar318 + fVar221 * fVar245;
    fVar164 = fVar321 * fVar325 + fVar221 * fVar272;
    fVar159 = fVar319 * fVar207 + fVar222 * fVar242;
    fVar315 = fVar319 * fVar255 + fVar222 * fVar243;
    fVar176 = fVar319 * fVar318 + fVar222 * fVar245;
    fVar161 = fVar319 * fVar325 + fVar222 * fVar272;
    fVar175 = (fVar317 * fVar207 + fVar321 * fVar242) * fVar207 + fVar242 * fVar327;
    fVar270 = (fVar317 * fVar255 + fVar321 * fVar243) * fVar255 + fVar243 * fVar328;
    fVar316 = (fVar317 * fVar318 + fVar321 * fVar245) * fVar318 + fVar245 * fVar302;
    fVar321 = (fVar317 * fVar325 + fVar321 * fVar272) * fVar325 + fVar272 * fVar164;
    fVar317 = (fVar330 * fVar207 + fVar319 * fVar242) * fVar207 + fVar242 * fVar159;
    fVar178 = (fVar330 * fVar255 + fVar319 * fVar243) * fVar255 + fVar243 * fVar315;
    fVar162 = (fVar330 * fVar318 + fVar319 * fVar245) * fVar318 + fVar245 * fVar176;
    fVar319 = (fVar330 * fVar325 + fVar319 * fVar272) * fVar325 + fVar272 * fVar161;
    fVar327 = fVar327 * fVar207 + (fVar221 * fVar207 + fVar209 * fVar242) * fVar242;
    fVar328 = fVar328 * fVar255 + (fVar221 * fVar255 + fVar209 * fVar243) * fVar243;
    fVar302 = fVar302 * fVar318 + (fVar221 * fVar318 + fVar209 * fVar245) * fVar245;
    fVar164 = fVar164 * fVar325 + (fVar221 * fVar325 + fVar209 * fVar272) * fVar272;
    fVar159 = fVar159 * fVar207 + (fVar222 * fVar207 + fVar218 * fVar242) * fVar242;
    fVar315 = fVar315 * fVar255 + (fVar222 * fVar255 + fVar218 * fVar243) * fVar243;
    fVar176 = fVar176 * fVar318 + (fVar222 * fVar318 + fVar218 * fVar245) * fVar245;
    fVar161 = fVar161 * fVar325 + (fVar222 * fVar325 + fVar218 * fVar272) * fVar272;
    local_358 = fVar207 * fVar175 + fVar242 * fVar327;
    fStack_354 = fVar255 * fVar270 + fVar243 * fVar328;
    fStack_350 = fVar318 * fVar316 + fVar245 * fVar302;
    fStack_34c = fVar325 * fVar321 + fVar272 * fVar164;
    local_258 = fVar207 * fVar317 + fVar242 * fVar159;
    fStack_254 = fVar255 * fVar178 + fVar243 * fVar315;
    fStack_250 = fVar318 * fVar162 + fVar245 * fVar176;
    fStack_24c = fVar325 * fVar319 + fVar272 * fVar161;
    fVar328 = (fVar328 - fVar270) * 3.0 * fVar240;
    fVar302 = (fVar302 - fVar316) * 3.0 * fVar240;
    fVar164 = (fVar164 - fVar321) * 3.0 * fVar240;
    fVar315 = (fVar315 - fVar178) * 3.0 * fVar240;
    fVar176 = (fVar176 - fVar162) * 3.0 * fVar240;
    fVar161 = (fVar161 - fVar319) * 3.0 * fVar240;
    local_328._4_4_ = fStack_350;
    local_328._0_4_ = fStack_354;
    local_328._8_4_ = fStack_34c;
    local_328._12_4_ = 0;
    local_1f8._4_4_ = fStack_250;
    local_1f8._0_4_ = fStack_254;
    local_338 = local_358 + (fVar327 - fVar175) * 3.0 * fVar240;
    fStack_334 = fStack_354 + fVar328;
    fStack_330 = fStack_350 + fVar302;
    fStack_32c = fStack_34c + fVar164;
    fVar175 = local_258 + (fVar159 - fVar317) * 3.0 * fVar240;
    fVar270 = fStack_254 + fVar315;
    fVar316 = fStack_250 + fVar176;
    fVar321 = fStack_24c + fVar161;
    local_348._0_4_ = fStack_354 - fVar328;
    local_348._4_4_ = fStack_350 - fVar302;
    local_348._8_4_ = fStack_34c - fVar164;
    local_348._12_4_ = 0;
    auVar91._0_4_ = fStack_254 - fVar315;
    auVar91._4_4_ = fStack_250 - fVar176;
    auVar91._8_4_ = fStack_24c - fVar161;
    auVar91._12_4_ = 0;
    fVar327 = fVar179 * fVar207 + fVar286 * fVar242;
    fVar328 = fVar179 * fVar255 + fVar286 * fVar243;
    fVar302 = fVar179 * fVar318 + fVar286 * fVar245;
    fVar164 = fVar179 * fVar325 + fVar286 * fVar272;
    fVar159 = fVar305 * fVar207 + fVar298 * fVar242;
    fVar315 = fVar305 * fVar255 + fVar298 * fVar243;
    fVar176 = fVar305 * fVar318 + fVar298 * fVar245;
    fVar161 = fVar305 * fVar325 + fVar298 * fVar272;
    fVar317 = (fVar331 * fVar207 + fVar179 * fVar242) * fVar207 + fVar242 * fVar327;
    fVar178 = (fVar331 * fVar255 + fVar179 * fVar243) * fVar255 + fVar243 * fVar328;
    fVar162 = (fVar331 * fVar318 + fVar179 * fVar245) * fVar318 + fVar245 * fVar302;
    fVar319 = (fVar331 * fVar325 + fVar179 * fVar272) * fVar325 + fVar272 * fVar164;
    fVar221 = (fVar208 * fVar207 + fVar305 * fVar242) * fVar207 + fVar242 * fVar159;
    fVar222 = (fVar208 * fVar255 + fVar305 * fVar243) * fVar255 + fVar243 * fVar315;
    fVar236 = (fVar208 * fVar318 + fVar305 * fVar245) * fVar318 + fVar245 * fVar176;
    fVar237 = (fVar208 * fVar325 + fVar305 * fVar272) * fVar325 + fVar272 * fVar161;
    fVar179 = fVar327 * fVar207 + (fVar286 * fVar207 + fVar220 * fVar242) * fVar242;
    fVar305 = fVar328 * fVar255 + (fVar286 * fVar255 + fVar220 * fVar243) * fVar243;
    fVar330 = fVar302 * fVar318 + (fVar286 * fVar318 + fVar220 * fVar245) * fVar245;
    fVar331 = fVar164 * fVar325 + (fVar286 * fVar325 + fVar220 * fVar272) * fVar272;
    fVar208 = fVar159 * fVar207 + (fVar298 * fVar207 + fVar238 * fVar242) * fVar242;
    fVar209 = fVar315 * fVar255 + (fVar298 * fVar255 + fVar238 * fVar243) * fVar243;
    fVar218 = fVar176 * fVar318 + (fVar298 * fVar318 + fVar238 * fVar245) * fVar245;
    fVar220 = fVar161 * fVar325 + (fVar298 * fVar325 + fVar238 * fVar272) * fVar272;
    fVar159 = fVar207 * fVar317 + fVar242 * fVar179;
    fVar315 = fVar255 * fVar178 + fVar243 * fVar305;
    fVar176 = fVar318 * fVar162 + fVar245 * fVar330;
    fVar161 = fVar325 * fVar319 + fVar272 * fVar331;
    fVar327 = fVar207 * fVar221 + fVar242 * fVar208;
    fVar328 = fVar255 * fVar222 + fVar243 * fVar209;
    fVar302 = fVar318 * fVar236 + fVar245 * fVar218;
    fVar164 = fVar325 * fVar237 + fVar272 * fVar220;
    fVar207 = (fVar305 - fVar178) * 3.0 * fVar240;
    fVar255 = (fVar330 - fVar162) * 3.0 * fVar240;
    fVar318 = (fVar331 - fVar319) * 3.0 * fVar240;
    fVar325 = (fVar209 - fVar222) * 3.0 * fVar240;
    fVar178 = (fVar218 - fVar236) * 3.0 * fVar240;
    fVar162 = (fVar220 - fVar237) * 3.0 * fVar240;
    local_208._4_4_ = fVar176;
    local_208._0_4_ = fVar315;
    local_208._8_4_ = fVar161;
    local_208._12_4_ = 0;
    local_228._4_4_ = fVar302;
    local_228._0_4_ = fVar328;
    local_228._8_4_ = fVar164;
    local_228._12_4_ = 0;
    local_248 = fVar159 + (fVar179 - fVar317) * 3.0 * fVar240;
    fStack_244 = fVar315 + fVar207;
    fStack_240 = fVar176 + fVar255;
    fStack_23c = fVar161 + fVar318;
    local_218 = fVar327 + (fVar208 - fVar221) * 3.0 * fVar240;
    fStack_214 = fVar328 + fVar325;
    fStack_210 = fVar302 + fVar178;
    fStack_20c = fVar164 + fVar162;
    local_1e8._0_4_ = fVar315 - fVar207;
    local_1e8._4_4_ = fVar176 - fVar255;
    local_1e8._8_4_ = fVar161 - fVar318;
    local_1e8._12_4_ = 0;
    local_238._0_4_ = fVar328 - fVar325;
    local_238._4_4_ = fVar302 - fVar178;
    local_238._8_4_ = fVar164 - fVar162;
    local_238._12_4_ = 0;
    fVar207 = (fVar315 - fStack_354) + (fVar159 - local_358);
    fVar255 = (fVar176 - fStack_350) + (fVar315 - fStack_354);
    fVar318 = (fVar161 - fStack_34c) + (fVar176 - fStack_350);
    fVar325 = (fVar161 - fStack_34c) + 0.0;
    local_1f8._8_4_ = fStack_24c;
    local_1f8._12_4_ = 0;
    fVar317 = (fVar328 - fStack_254) + (fVar327 - local_258);
    fVar178 = (fVar302 - fStack_250) + (fVar328 - fStack_254);
    fVar162 = (fVar164 - fStack_24c) + (fVar302 - fStack_250);
    fVar319 = (fVar164 - fStack_24c) + 0.0;
    auVar228._0_8_ =
         CONCAT44(fStack_254 * fVar255 - fStack_354 * fVar178,
                  local_258 * fVar207 - local_358 * fVar317);
    auVar228._8_4_ = fStack_250 * fVar318 - fStack_350 * fVar162;
    auVar228._12_4_ = fStack_24c * fVar325 - fStack_34c * fVar319;
    auVar165._0_4_ = fVar175 * fVar207 - local_338 * fVar317;
    auVar165._4_4_ = fVar270 * fVar255 - fStack_334 * fVar178;
    auVar165._8_4_ = fVar316 * fVar318 - fStack_330 * fVar162;
    auVar165._12_4_ = fVar321 * fVar325 - fStack_32c * fVar319;
    auVar197._0_8_ =
         CONCAT44(auVar91._4_4_ * fVar255 - fVar178 * local_348._4_4_,
                  auVar91._0_4_ * fVar207 - fVar317 * local_348._0_4_);
    auVar197._8_4_ = auVar91._8_4_ * fVar318 - fVar162 * local_348._8_4_;
    auVar197._12_4_ = fVar325 * 0.0 - fVar319 * 0.0;
    auVar311._0_4_ = fVar207 * fStack_254 - fVar317 * fStack_354;
    auVar311._4_4_ = fVar255 * fStack_250 - fVar178 * fStack_350;
    auVar311._8_4_ = fVar318 * fStack_24c - fVar162 * fStack_34c;
    auVar311._12_4_ = fVar325 * 0.0 - fVar319 * 0.0;
    auVar263._0_8_ =
         CONCAT44(fVar328 * fVar255 - fVar315 * fVar178,fVar327 * fVar207 - fVar159 * fVar317);
    auVar263._8_4_ = fVar302 * fVar318 - fVar176 * fVar162;
    auVar263._12_4_ = fVar164 * fVar325 - fVar161 * fVar319;
    auVar323._0_4_ = local_218 * fVar207 - local_248 * fVar317;
    auVar323._4_4_ = fStack_214 * fVar255 - fStack_244 * fVar178;
    auVar323._8_4_ = fStack_210 * fVar318 - fStack_240 * fVar162;
    auVar323._12_4_ = fStack_20c * fVar325 - fStack_23c * fVar319;
    auVar247._0_8_ =
         CONCAT44(local_238._4_4_ * fVar255 - fVar178 * local_1e8._4_4_,
                  local_238._0_4_ * fVar207 - fVar317 * local_1e8._0_4_);
    auVar247._8_4_ = local_238._8_4_ * fVar318 - fVar162 * local_1e8._8_4_;
    auVar247._12_4_ = fVar325 * 0.0 - fVar319 * 0.0;
    auVar92._0_4_ = fVar207 * fVar328 - fVar317 * fVar315;
    auVar92._4_4_ = fVar255 * fVar302 - fVar178 * fVar176;
    auVar92._8_4_ = fVar318 * fVar164 - fVar162 * fVar161;
    auVar92._12_4_ = fVar325 * 0.0 - fVar319 * 0.0;
    auVar125._8_4_ = auVar228._8_4_;
    auVar125._0_8_ = auVar228._0_8_;
    auVar125._12_4_ = auVar228._12_4_;
    auVar70 = minps(auVar125,auVar165);
    auVar262 = maxps(auVar228,auVar165);
    auVar166._8_4_ = auVar197._8_4_;
    auVar166._0_8_ = auVar197._0_8_;
    auVar166._12_4_ = auVar197._12_4_;
    auVar139 = minps(auVar166,auVar311);
    auVar70 = minps(auVar70,auVar139);
    auVar139 = maxps(auVar197,auVar311);
    auVar141 = maxps(auVar262,auVar139);
    auVar167._8_4_ = auVar263._8_4_;
    auVar167._0_8_ = auVar263._0_8_;
    auVar167._12_4_ = auVar263._12_4_;
    auVar139 = minps(auVar167,auVar323);
    auVar264 = maxps(auVar263,auVar323);
    auVar198._8_4_ = auVar247._8_4_;
    auVar198._0_8_ = auVar247._0_8_;
    auVar198._12_4_ = auVar247._12_4_;
    auVar262 = minps(auVar198,auVar92);
    auVar139 = minps(auVar139,auVar262);
    auVar70 = minps(auVar70,auVar139);
    auVar139 = maxps(auVar247,auVar92);
    auVar139 = maxps(auVar264,auVar139);
    auVar139 = maxps(auVar141,auVar139);
    auVar229._0_4_ =
         -(uint)(local_278 <= auVar139._0_4_ && auVar70._0_4_ <= local_268) & local_288._0_4_;
    auVar229._4_4_ =
         -(uint)(fStack_274 <= auVar139._4_4_ && auVar70._4_4_ <= fStack_264) & local_288._4_4_;
    auVar229._8_4_ =
         -(uint)(fStack_270 <= auVar139._8_4_ && auVar70._8_4_ <= fStack_260) & local_288._8_4_;
    auVar229._12_4_ =
         -(uint)(fStack_26c <= auVar139._12_4_ && auVar70._12_4_ <= fStack_25c) & local_288._12_4_;
    uVar67 = movmskps((int)uVar55,auVar229);
    uVar55 = (ulong)uVar67;
    if (uVar67 != 0) {
      fVar207 = (fVar315 - fVar159) + (fStack_354 - local_358);
      fVar255 = (fVar176 - fVar315) + (fStack_350 - fStack_354);
      fVar318 = (fVar161 - fVar176) + (fStack_34c - fStack_350);
      fVar325 = (0.0 - fVar161) + (0.0 - fStack_34c);
      fVar317 = (fVar328 - fVar327) + (fStack_254 - local_258);
      fVar178 = (fVar302 - fVar328) + (fStack_250 - fStack_254);
      fVar162 = (fVar164 - fVar302) + (fStack_24c - fStack_250);
      fVar319 = (0.0 - fVar164) + (0.0 - fStack_24c);
      auVar332._0_8_ =
           CONCAT44(fStack_254 * fVar255 - fStack_354 * fVar178,
                    local_258 * fVar207 - local_358 * fVar317);
      auVar332._8_4_ = fStack_250 * fVar318 - fStack_350 * fVar162;
      auVar332._12_4_ = fStack_24c * fVar325 - fStack_34c * fVar319;
      auVar168._0_4_ = fVar175 * fVar207 - local_338 * fVar317;
      auVar168._4_4_ = fVar270 * fVar255 - fStack_334 * fVar178;
      auVar168._8_4_ = fVar316 * fVar318 - fStack_330 * fVar162;
      auVar168._12_4_ = fVar321 * fVar325 - fStack_32c * fVar319;
      auVar248._0_8_ =
           CONCAT44(auVar91._4_4_ * fVar255 - local_348._4_4_ * fVar178,
                    auVar91._0_4_ * fVar207 - local_348._0_4_ * fVar317);
      auVar248._8_4_ = auVar91._8_4_ * fVar318 - local_348._8_4_ * fVar162;
      auVar248._12_4_ = fVar325 * 0.0 - fVar319 * 0.0;
      auVar199._0_4_ = fStack_254 * fVar207 - fStack_354 * fVar317;
      auVar199._4_4_ = fStack_250 * fVar255 - fStack_350 * fVar178;
      auVar199._8_4_ = fStack_24c * fVar318 - fStack_34c * fVar162;
      auVar199._12_4_ = fVar325 * 0.0 - fVar319 * 0.0;
      auVar146._0_8_ =
           CONCAT44(fVar328 * fVar255 - fVar315 * fVar178,fVar327 * fVar207 - fVar159 * fVar317);
      auVar146._8_4_ = fVar302 * fVar318 - fVar176 * fVar162;
      auVar146._12_4_ = fVar164 * fVar325 - fVar161 * fVar319;
      auVar278._0_4_ = local_218 * fVar207 - local_248 * fVar317;
      auVar278._4_4_ = fStack_214 * fVar255 - fStack_244 * fVar178;
      auVar278._8_4_ = fStack_210 * fVar318 - fStack_240 * fVar162;
      auVar278._12_4_ = fStack_20c * fVar325 - fStack_23c * fVar319;
      auVar312._0_8_ =
           CONCAT44(local_238._4_4_ * fVar255 - local_1e8._4_4_ * fVar178,
                    local_238._0_4_ * fVar207 - local_1e8._0_4_ * fVar317);
      auVar312._8_4_ = local_238._8_4_ * fVar318 - local_1e8._8_4_ * fVar162;
      auVar312._12_4_ = fVar325 * 0.0 - fVar319 * 0.0;
      auVar93._0_4_ = fVar207 * fVar328 - fVar317 * fVar315;
      auVar93._4_4_ = fVar255 * fVar302 - fVar178 * fVar176;
      auVar93._8_4_ = fVar318 * fVar164 - fVar162 * fVar161;
      auVar93._12_4_ = fVar325 * 0.0 - fVar319 * 0.0;
      auVar126._8_4_ = auVar332._8_4_;
      auVar126._0_8_ = auVar332._0_8_;
      auVar126._12_4_ = auVar332._12_4_;
      auVar70 = minps(auVar126,auVar168);
      auVar262 = maxps(auVar332,auVar168);
      auVar169._8_4_ = auVar248._8_4_;
      auVar169._0_8_ = auVar248._0_8_;
      auVar169._12_4_ = auVar248._12_4_;
      auVar139 = minps(auVar169,auVar199);
      auVar70 = minps(auVar70,auVar139);
      auVar139 = maxps(auVar248,auVar199);
      auVar264 = maxps(auVar262,auVar139);
      auVar170._8_4_ = auVar146._8_4_;
      auVar170._0_8_ = auVar146._0_8_;
      auVar170._12_4_ = auVar146._12_4_;
      auVar262 = minps(auVar170,auVar278);
      auVar139 = maxps(auVar146,auVar278);
      auVar200._8_4_ = auVar312._8_4_;
      auVar200._0_8_ = auVar312._0_8_;
      auVar200._12_4_ = auVar312._12_4_;
      auVar141 = minps(auVar200,auVar93);
      auVar262 = minps(auVar262,auVar141);
      auVar70 = minps(auVar70,auVar262);
      auVar262 = maxps(auVar312,auVar93);
      auVar139 = maxps(auVar139,auVar262);
      auVar139 = maxps(auVar264,auVar139);
      auVar333._0_4_ =
           -(uint)(local_278 <= auVar139._0_4_ && auVar70._0_4_ <= local_268) & auVar229._0_4_;
      auVar333._4_4_ =
           -(uint)(fStack_274 <= auVar139._4_4_ && auVar70._4_4_ <= fStack_264) & auVar229._4_4_;
      auVar333._8_4_ =
           -(uint)(fStack_270 <= auVar139._8_4_ && auVar70._8_4_ <= fStack_260) & auVar229._8_4_;
      auVar333._12_4_ =
           -(uint)(fStack_26c <= auVar139._12_4_ && auVar70._12_4_ <= fStack_25c) & auVar229._12_4_;
      uVar67 = movmskps(uVar67,auVar333);
      uVar55 = (ulong)uVar67;
      if (uVar67 != 0) {
        uVar55 = (ulong)(byte)uVar67;
        auStack_318[uVar60] = uVar67 & 0xff;
        *(ulong *)(afStack_108 + uVar60 * 2) = CONCAT44(fVar163,fVar135);
        *(ulong *)(afStack_58 + uVar60 * 2) = CONCAT44(fVar109,fVar108);
        uVar60 = (ulong)((int)uVar60 + 1);
      }
    }
LAB_00b13cc6:
    _local_508 = auVar91;
    auVar70 = _local_508;
    if ((int)uVar60 == 0) {
      fVar149 = *(float *)(ray + k * 4 + 0x80);
      auVar134._4_4_ = -(uint)(fStack_2e4 <= fVar149);
      auVar134._0_4_ = -(uint)(local_2e8 <= fVar149);
      auVar134._8_4_ = -(uint)(fStack_2e0 <= fVar149);
      auVar134._12_4_ = -(uint)(fStack_2dc <= fVar149);
      uVar64 = movmskps((int)uVar55,auVar134);
      uVar62 = uVar62 & (uint)local_390 & uVar64;
      if (uVar62 == 0) {
        return;
      }
      goto LAB_00b127d5;
    }
    uVar53 = (int)uVar60 - 1;
    uVar55 = (ulong)uVar53;
    uVar67 = auStack_318[uVar55];
    fVar108 = afStack_58[uVar55 * 2];
    fVar109 = afStack_58[uVar55 * 2 + 1];
    uVar5 = 0;
    if (uVar67 != 0) {
      for (; (uVar67 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
      }
    }
    uVar67 = uVar67 - 1 & uVar67;
    auStack_318[uVar55] = uVar67;
    if (uVar67 == 0) {
      uVar60 = (ulong)uVar53;
    }
    fVar163 = (float)(uVar5 + 1) * 0.33333334;
    fVar175 = afStack_108[uVar55 * 2];
    fVar207 = afStack_108[uVar55 * 2 + 1];
    fVar135 = fVar175 * (1.0 - (float)uVar5 * 0.33333334) + fVar207 * (float)uVar5 * 0.33333334;
    fVar163 = fVar175 * (1.0 - fVar163) + fVar207 * fVar163;
    fVar270 = fVar175 * 0.0 + fVar207 * 0.0;
    fVar207 = fVar175 * 0.0 + fVar207 * 0.0;
    fVar175 = fVar163 - fVar135;
    if (fVar175 < 0.16666667) {
      fVar327 = 1.0 - fVar108;
      fVar302 = 1.0 - fVar108;
      fVar315 = 1.0 - fVar109;
      fVar176 = 1.0 - fVar109;
      fVar325 = fVar283 * fVar327 + fVar285 * fVar108;
      fVar328 = fVar284 * fVar302 + fVar297 * fVar108;
      fVar164 = fVar283 * fVar315 + fVar285 * fVar109;
      fVar159 = fVar284 * fVar176 + fVar297 * fVar109;
      fVar255 = fVar304 * fVar327 + fVar299 * fVar108;
      fVar316 = fVar314 * fVar302 + fVar301 * fVar108;
      fVar318 = fVar304 * fVar315 + fVar299 * fVar109;
      fVar321 = fVar314 * fVar176 + fVar301 * fVar109;
      fVar331 = fVar235 * fVar327 + fVar210 * fVar108;
      fVar209 = fVar239 * fVar302 + fVar214 * fVar108;
      fVar220 = fVar235 * fVar315 + fVar210 * fVar109;
      fVar222 = fVar239 * fVar176 + fVar214 * fVar109;
      fVar319 = (fVar327 * fVar216 + fVar108 * fVar149) - fVar331;
      fVar179 = (fVar302 * fVar219 + fVar108 * fVar69) - fVar209;
      fVar305 = (fVar315 * fVar216 + fVar109 * fVar149) - fVar220;
      fVar330 = (fVar176 * fVar219 + fVar109 * fVar69) - fVar222;
      fVar327 = fVar135 * (fVar331 - fVar255) + fVar255;
      fVar302 = fVar135 * (fVar209 - fVar316) + fVar316;
      fVar315 = fVar135 * (fVar220 - fVar318) + fVar318;
      fVar176 = fVar135 * (fVar222 - fVar321) + fVar321;
      fVar208 = (fVar331 - fVar255) * fVar163 + fVar255;
      fVar218 = (fVar209 - fVar316) * fVar163 + fVar316;
      fVar221 = (fVar220 - fVar318) * fVar163 + fVar318;
      fVar236 = (fVar222 - fVar321) * fVar163 + fVar321;
      fVar161 = fVar135 * (fVar255 - fVar325) + fVar325;
      fVar317 = fVar135 * (fVar316 - fVar328) + fVar328;
      fVar178 = fVar135 * (fVar318 - fVar164) + fVar164;
      fVar162 = fVar135 * (fVar321 - fVar159) + fVar159;
      fVar161 = (fVar327 - fVar161) * fVar135 + fVar161;
      fVar317 = (fVar302 - fVar317) * fVar135 + fVar317;
      fVar178 = (fVar315 - fVar178) * fVar135 + fVar178;
      fVar162 = (fVar176 - fVar162) * fVar135 + fVar162;
      fVar327 = (((fVar135 * fVar319 + fVar331) - fVar327) * fVar135 + fVar327) - fVar161;
      fVar302 = (((fVar135 * fVar179 + fVar209) - fVar302) * fVar135 + fVar302) - fVar317;
      fVar315 = (((fVar135 * fVar305 + fVar220) - fVar315) * fVar135 + fVar315) - fVar178;
      fVar176 = (((fVar135 * fVar330 + fVar222) - fVar176) * fVar135 + fVar176) - fVar162;
      fVar161 = fVar135 * fVar327 + fVar161;
      fVar317 = fVar135 * fVar302 + fVar317;
      fVar178 = fVar135 * fVar315 + fVar178;
      fVar162 = fVar135 * fVar176 + fVar162;
      fVar325 = (fVar255 - fVar325) * fVar163 + fVar325;
      fVar328 = (fVar316 - fVar328) * fVar163 + fVar328;
      fVar164 = (fVar318 - fVar164) * fVar163 + fVar164;
      fVar159 = (fVar321 - fVar159) * fVar163 + fVar159;
      fVar325 = (fVar208 - fVar325) * fVar163 + fVar325;
      fVar328 = (fVar218 - fVar328) * fVar163 + fVar328;
      fVar164 = (fVar221 - fVar164) * fVar163 + fVar164;
      fVar159 = (fVar236 - fVar159) * fVar163 + fVar159;
      fVar316 = (((fVar319 * fVar163 + fVar331) - fVar208) * fVar163 + fVar208) - fVar325;
      fVar318 = (((fVar179 * fVar163 + fVar209) - fVar218) * fVar163 + fVar218) - fVar328;
      fVar321 = (((fVar305 * fVar163 + fVar220) - fVar221) * fVar163 + fVar221) - fVar164;
      fVar218 = (((fVar330 * fVar163 + fVar222) - fVar236) * fVar163 + fVar236) - fVar159;
      fVar325 = fVar163 * fVar316 + fVar325;
      fVar328 = fVar163 * fVar318 + fVar328;
      fVar164 = fVar163 * fVar321 + fVar164;
      fVar159 = fVar163 * fVar218 + fVar159;
      fVar255 = fVar175 * 0.33333334;
      fVar319 = fVar327 * (float)DAT_01f7ff50 * fVar255 + fVar161;
      fVar179 = fVar302 * DAT_01f7ff50._4_4_ * fVar255 + fVar317;
      fVar305 = fVar315 * DAT_01f7ff50._8_4_ * fVar255 + fVar178;
      fVar330 = fVar176 * DAT_01f7ff50._12_4_ * fVar255 + fVar162;
      fVar331 = fVar325 - fVar255 * fVar316 * (float)DAT_01f7ff50;
      fVar208 = fVar328 - fVar255 * fVar318 * DAT_01f7ff50._4_4_;
      fVar209 = fVar164 - fVar255 * fVar321 * DAT_01f7ff50._8_4_;
      fVar218 = fVar159 - fVar255 * fVar218 * DAT_01f7ff50._12_4_;
      auVar23._4_8_ = DAT_01f7ff50._8_8_;
      auVar23._0_4_ = fVar328;
      auVar249._0_8_ = auVar23._0_8_ << 0x20;
      auVar249._8_4_ = fVar164;
      auVar249._12_4_ = fVar159;
      fVar327 = (fVar164 - fVar325) + (fVar178 - fVar161);
      fVar302 = (fVar159 - fVar328) + (fVar162 - fVar317);
      auVar265._0_4_ = fVar208 * fVar302;
      auVar265._4_4_ = fVar208 * fVar302;
      auVar265._8_4_ = fVar218 * fVar302;
      auVar265._12_4_ = fVar218 * fVar302;
      fVar255 = fVar161 * fVar327 + fVar317 * fVar302;
      fVar316 = fVar178 * fVar327 + fVar162 * fVar302;
      fVar315 = fVar319 * fVar327 + fVar179 * fVar302;
      fVar176 = fVar305 * fVar327 + fVar330 * fVar302;
      fVar220 = fVar331 * fVar327 + auVar265._0_4_;
      auVar230._0_8_ = CONCAT44(fVar208 * fVar327 + auVar265._4_4_,fVar220);
      auVar230._8_4_ = fVar209 * fVar327 + auVar265._8_4_;
      auVar230._12_4_ = fVar218 * fVar327 + auVar265._12_4_;
      fVar321 = fVar327 * fVar325 + fVar302 * fVar328;
      fVar221 = fVar327 * fVar164 + fVar302 * fVar159;
      auVar24._4_8_ = auVar265._8_8_;
      auVar24._0_4_ = fVar179 * fVar327 + fVar179 * fVar302;
      auVar266._0_8_ = auVar24._0_8_ << 0x20;
      auVar266._8_4_ = fVar176;
      auVar266._12_4_ = fVar330 * fVar327 + fVar330 * fVar302;
      fVar318 = fVar315;
      if (fVar315 <= fVar255) {
        fVar318 = fVar255;
        fVar255 = fVar315;
      }
      auVar267._8_8_ = auVar266._8_8_;
      auVar267._0_8_ = auVar267._8_8_;
      auVar94._8_4_ = auVar230._8_4_;
      auVar94._0_8_ = auVar230._0_8_;
      auVar94._12_4_ = auVar230._12_4_;
      if (fVar321 <= fVar220) {
        auVar94._0_4_ = fVar321;
      }
      if (auVar94._0_4_ <= fVar255) {
        fVar255 = auVar94._0_4_;
      }
      auVar25._4_8_ = auVar94._8_8_;
      auVar25._0_4_ = fVar327 * fVar328 + fVar302 * fVar328;
      auVar95._0_8_ = auVar25._0_8_ << 0x20;
      auVar95._8_4_ = fVar221;
      auVar95._12_4_ = fVar327 * fVar159 + fVar302 * fVar159;
      if (fVar321 <= fVar220) {
        fVar321 = fVar220;
      }
      auVar96._8_8_ = auVar95._8_8_;
      auVar96._0_8_ = auVar96._8_8_;
      if (fVar321 <= fVar318) {
        fVar321 = fVar318;
      }
      if (fVar176 <= fVar316) {
        auVar267._0_4_ = fVar316;
        fVar316 = fVar176;
      }
      auVar127._8_4_ = auVar230._8_4_;
      auVar127._0_8_ = auVar230._8_8_;
      auVar127._12_4_ = auVar230._12_4_;
      if (fVar221 <= auVar230._8_4_) {
        auVar127._0_4_ = fVar221;
      }
      if (auVar127._0_4_ <= fVar316) {
        fVar316 = auVar127._0_4_;
      }
      if (fVar221 <= auVar230._8_4_) {
        auVar96._0_4_ = auVar230._8_4_;
      }
      if (auVar96._0_4_ <= auVar267._0_4_) {
        auVar96._0_4_ = auVar267._0_4_;
      }
      bVar61 = 3 < (uint)uVar60;
      uVar26 = (undefined3)(uVar53 >> 8);
      uVar55 = (ulong)CONCAT31(uVar26,bVar61);
      fVar318 = auVar96._0_4_;
      if ((0.0001 <= fVar255) || (fVar318 <= -0.0001)) break;
      goto LAB_00b14031;
    }
  } while( true );
  if ((fVar316 < 0.0001 && -0.0001 < fVar321) ||
     ((fVar255 < 0.0001 && -0.0001 < fVar321 ||
      (auVar91 = _local_508, fVar316 < 0.0001 && -0.0001 < fVar318)))) {
LAB_00b14031:
    local_508 = (undefined1  [8])auVar249._8_8_;
    auVar91 = _local_508;
    local_4f8 = (RayHitK<4> *)CONCAT44(fVar159,fVar164);
    bVar61 = bVar61 || fVar175 < 0.001;
    uVar55 = (ulong)CONCAT31(uVar26,bVar61);
    fVar302 = (float)(~-(uint)(fVar255 < 0.0) & 0x3f800000 | -(uint)(fVar255 < 0.0) & 0xbf800000);
    fVar315 = (float)(~-(uint)(fVar321 < 0.0) & 0x3f800000 | -(uint)(fVar321 < 0.0) & 0xbf800000);
    fVar327 = 0.0;
    if ((fVar302 == fVar315) && (!NAN(fVar302) && !NAN(fVar315))) {
      fVar327 = INFINITY;
    }
    fVar176 = 0.0;
    if ((fVar302 == fVar315) && (!NAN(fVar302) && !NAN(fVar315))) {
      fVar176 = -INFINITY;
    }
    fVar220 = (float)(~-(uint)(fVar316 < 0.0) & 0x3f800000 | -(uint)(fVar316 < 0.0) & 0xbf800000);
    if ((fVar302 != fVar220) || (fVar221 = fVar176, NAN(fVar302) || NAN(fVar220))) {
      if ((fVar316 != fVar255) || (NAN(fVar316) || NAN(fVar255))) {
        fVar316 = -fVar255 / (fVar316 - fVar255);
        fVar316 = (1.0 - fVar316) * 0.0 + fVar316;
        fVar221 = fVar316;
      }
      else {
        fVar316 = 0.0;
        if ((fVar255 != 0.0) || (fVar221 = 1.0, NAN(fVar255))) {
          fVar316 = INFINITY;
          fVar221 = -INFINITY;
        }
      }
      if (fVar316 <= fVar327) {
        fVar327 = fVar316;
      }
      if (fVar221 <= fVar176) {
        fVar221 = fVar176;
      }
    }
    fVar255 = *(float *)(&DAT_01f80eb4 + (ulong)(fVar318 < 0.0) * 4);
    if ((fVar315 != fVar255) || (fVar316 = fVar221, NAN(fVar315) || NAN(fVar255))) {
      if ((fVar318 != fVar321) || (NAN(fVar318) || NAN(fVar321))) {
        fVar302 = -fVar321 / (fVar318 - fVar321);
        fVar302 = (1.0 - fVar302) * 0.0 + fVar302;
        fVar316 = fVar302;
      }
      else {
        fVar302 = 0.0;
        if ((fVar321 != 0.0) || (fVar316 = 1.0, NAN(fVar321))) {
          fVar302 = INFINITY;
          fVar316 = -INFINITY;
        }
      }
      if (fVar302 <= fVar327) {
        fVar327 = fVar302;
      }
      if (fVar316 <= fVar221) {
        fVar316 = fVar221;
      }
    }
    if ((fVar220 != fVar255) || (NAN(fVar220) || NAN(fVar255))) {
      fVar327 = (float)(~-(uint)(fVar327 < 1.0) & 0x3f800000 |
                       (uint)fVar327 & -(uint)(fVar327 < 1.0));
      fVar316 = (float)(~-(uint)(fVar316 < 1.0) & (uint)fVar316 |
                       -(uint)(fVar316 < 1.0) & 0x3f800000);
    }
    fVar327 = (float)(~-(uint)(fVar327 < 0.0) & (uint)fVar327);
    fVar255 = (float)(~-(uint)(fVar316 < 1.0) & 0x3f800000 | (uint)fVar316 & -(uint)(fVar316 < 1.0))
    ;
    fStack_500 = auVar70._8_4_;
    fStack_4fc = auVar70._12_4_;
    if (fVar327 <= fVar255) {
      fVar327 = fVar327 + -0.1;
      fVar255 = fVar255 + 0.1;
      uVar67 = -(uint)(fVar255 < 1.0);
      fVar327 = (float)(~-(uint)(fVar327 < 0.0) & (uint)fVar327);
      fVar255 = (float)(~uVar67 & 0x3f800000 | (uint)fVar255 & uVar67);
      fVar220 = 1.0 - fVar327;
      fVar221 = 1.0 - fVar327;
      fVar222 = 1.0 - fVar255;
      fVar236 = 1.0 - fVar255;
      fVar316 = fVar161 * fVar220 + fVar178 * fVar327;
      fVar321 = fVar317 * fVar221 + fVar162 * fVar327;
      fVar302 = fVar161 * fVar222 + fVar178 * fVar255;
      fVar315 = fVar317 * fVar236 + fVar162 * fVar255;
      fVar176 = fVar319 * fVar220 + fVar305 * fVar327;
      fVar161 = fVar179 * fVar221 + fVar330 * fVar327;
      fVar317 = fVar319 * fVar222 + fVar305 * fVar255;
      fVar178 = fVar179 * fVar236 + fVar330 * fVar255;
      fVar162 = fVar331 * fVar220 + fVar209 * fVar327;
      fVar319 = fVar208 * fVar221 + fVar218 * fVar327;
      fVar179 = fVar331 * fVar222 + fVar209 * fVar255;
      fVar305 = fVar208 * fVar236 + fVar218 * fVar255;
      fVar164 = fVar220 * fVar325 + fVar164 * fVar327;
      fVar159 = fVar221 * fVar328 + fVar159 * fVar327;
      fVar325 = fVar222 * fVar325 + fStack_500 * fVar255;
      fVar328 = fVar236 * fVar328 + fStack_4fc * fVar255;
      fVar330 = fVar108 * (1.0 - fVar255);
      fVar108 = fVar108 * (1.0 - fVar327) + fVar109 * fVar327;
      fVar109 = fVar330 + fVar109 * fVar255;
      fVar175 = 1.0 / fVar175;
      auVar128._0_4_ = fVar325 - fVar164;
      auVar128._4_4_ = fVar328 - fVar159;
      auVar128._8_4_ = fVar325 - fVar325;
      auVar128._12_4_ = fVar328 - fVar328;
      auVar156._0_8_ = CONCAT44(fVar305 - fVar319,fVar179 - fVar162);
      auVar156._8_4_ = fVar179 - fVar179;
      auVar156._12_4_ = fVar305 - fVar305;
      auVar201._0_4_ = fVar317 - fVar176;
      auVar201._4_4_ = fVar178 - fVar161;
      auVar201._8_4_ = fVar317 - fVar317;
      auVar201._12_4_ = fVar178 - fVar178;
      auVar268._0_8_ = CONCAT44((fVar161 - fVar321) * 3.0,(fVar176 - fVar316) * 3.0);
      auVar268._8_4_ = (fVar317 - fVar302) * 3.0;
      auVar268._12_4_ = (fVar178 - fVar315) * 3.0;
      auVar171._0_8_ = CONCAT44((fVar319 - fVar161) * 3.0,(fVar162 - fVar176) * 3.0);
      auVar171._8_4_ = (fVar179 - fVar317) * 3.0;
      auVar171._12_4_ = (fVar305 - fVar178) * 3.0;
      auVar293._0_4_ = (fVar164 - fVar162) * 3.0;
      auVar293._4_4_ = (fVar159 - fVar319) * 3.0;
      auVar293._8_4_ = (fVar325 - fVar179) * 3.0;
      auVar293._12_4_ = (fVar328 - fVar305) * 3.0;
      auVar231._8_4_ = auVar171._8_4_;
      auVar231._0_8_ = auVar171._0_8_;
      auVar231._12_4_ = auVar171._12_4_;
      auVar139 = minps(auVar231,auVar293);
      auVar70 = maxps(auVar171,auVar293);
      auVar279._8_4_ = auVar268._8_4_;
      auVar279._0_8_ = auVar268._0_8_;
      auVar279._12_4_ = auVar268._12_4_;
      auVar141 = minps(auVar279,auVar139);
      auVar262 = maxps(auVar268,auVar70);
      auVar27._4_8_ = auVar70._8_8_;
      auVar27._0_4_ = auVar141._4_4_;
      auVar172._0_8_ = auVar27._0_8_ << 0x20;
      auVar172._8_4_ = auVar141._8_4_;
      auVar172._12_4_ = auVar141._12_4_;
      auVar173._8_8_ = auVar141._8_8_;
      auVar173._0_8_ = auVar172._8_8_;
      auVar28._4_8_ = auVar139._8_8_;
      auVar28._0_4_ = auVar262._4_4_;
      auVar232._0_8_ = auVar28._0_8_ << 0x20;
      auVar232._8_4_ = auVar262._8_4_;
      auVar232._12_4_ = auVar262._12_4_;
      auVar233._8_8_ = auVar262._8_8_;
      auVar233._0_8_ = auVar232._8_8_;
      auVar139 = minps(auVar141,auVar173);
      auVar70 = maxps(auVar262,auVar233);
      fVar220 = auVar139._0_4_ * fVar175;
      fVar221 = auVar139._4_4_ * fVar175;
      fVar222 = auVar139._8_4_ * fVar175;
      fVar236 = auVar139._12_4_ * fVar175;
      fVar317 = fVar175 * auVar70._0_4_;
      fVar162 = fVar175 * auVar70._4_4_;
      fVar179 = fVar175 * auVar70._8_4_;
      fVar175 = fVar175 * auVar70._12_4_;
      fVar209 = 1.0 / (fVar109 - fVar108);
      auVar97._0_8_ = CONCAT44(fVar315 - fVar321,fVar302 - fVar316);
      auVar97._8_4_ = fVar302 - fVar302;
      auVar97._12_4_ = fVar315 - fVar315;
      auVar250._8_4_ = auVar97._8_4_;
      auVar250._0_8_ = auVar97._0_8_;
      auVar250._12_4_ = auVar97._12_4_;
      auVar262 = minps(auVar250,auVar201);
      auVar70 = maxps(auVar97,auVar201);
      auVar147._8_4_ = auVar156._8_4_;
      auVar147._0_8_ = auVar156._0_8_;
      auVar147._12_4_ = auVar156._12_4_;
      auVar139 = minps(auVar147,auVar128);
      auVar262 = minps(auVar262,auVar139);
      auVar139 = maxps(auVar156,auVar128);
      auVar70 = maxps(auVar70,auVar139);
      fVar331 = auVar262._0_4_ * fVar209;
      fVar208 = auVar262._4_4_ * fVar209;
      fVar218 = fVar209 * auVar70._0_4_;
      fVar209 = fVar209 * auVar70._4_4_;
      local_508._4_4_ = fVar108;
      local_508._0_4_ = fVar135;
      fStack_500 = fVar163;
      fStack_4fc = fVar109;
      auVar234._4_4_ = fVar109;
      auVar234._0_4_ = fVar163;
      auVar234._8_4_ = fVar270;
      auVar234._12_4_ = fVar207;
      fVar159 = (fVar135 + fVar163) * 0.5;
      fVar315 = (fVar108 + fVar109) * 0.5;
      fVar176 = (fVar163 + fVar270) * 0.0;
      fVar161 = (fVar109 + fVar207) * 0.0;
      fVar255 = local_138 * fVar159 + fVar283;
      fVar316 = fStack_134 * fVar159 + fVar284;
      fVar321 = fStack_130 * fVar159 + 0.0;
      fVar325 = fStack_12c * fVar159 + 0.0;
      fVar327 = local_148 * fVar159 + fVar304;
      fVar328 = fStack_144 * fVar159 + fVar314;
      fVar302 = fStack_140 * fVar159 + fVar299;
      fVar164 = fStack_13c * fVar159 + fVar301;
      fVar255 = (fVar327 - fVar255) * fVar159 + fVar255;
      fVar316 = (fVar328 - fVar316) * fVar159 + fVar316;
      fVar321 = (fVar302 - fVar321) * fVar159 + fVar321;
      fVar325 = (fVar164 - fVar325) * fVar159 + fVar325;
      fVar327 = (((local_158 * fVar159 + fVar235) - fVar327) * fVar159 + fVar327) - fVar255;
      fVar328 = (((fStack_154 * fVar159 + fVar239) - fVar328) * fVar159 + fVar328) - fVar316;
      fVar302 = (((fStack_150 * fVar159 + fVar241) - fVar302) * fVar159 + fVar302) - fVar321;
      fVar164 = (((fStack_14c * fVar159 + fVar244) - fVar164) * fVar159 + fVar164) - fVar325;
      fVar255 = fVar159 * fVar327 + fVar255;
      fVar316 = fVar159 * fVar328 + fVar316;
      fVar327 = fVar327 * 3.0;
      fVar328 = fVar328 * 3.0;
      fVar321 = (fVar159 * fVar302 + fVar321) - fVar255;
      fVar325 = (fVar159 * fVar164 + fVar325) - fVar316;
      fVar327 = (fVar302 * 3.0 - fVar327) * fVar315 + fVar327;
      fVar328 = (fVar164 * 3.0 - fVar328) * fVar315 + fVar328;
      auVar157._0_8_ = CONCAT44(fVar327,fVar321) ^ 0x80000000;
      auVar157._8_4_ = fVar327;
      auVar157._12_4_ = fVar327;
      fVar237 = fVar135 - fVar159;
      fVar238 = fVar108 - fVar315;
      fVar240 = fVar163 - fVar176;
      fVar242 = fVar109 - fVar161;
      fVar243 = fVar163 - fVar159;
      fVar245 = fVar109 - fVar315;
      fVar270 = fVar270 - fVar176;
      fVar207 = fVar207 - fVar161;
      fVar255 = fVar321 * fVar315 + fVar255;
      fVar316 = fVar325 * fVar315 + fVar316;
      auVar174._0_8_ = CONCAT44(fVar328,fVar325) ^ 0x8000000000000000;
      auVar174._8_4_ = -fVar328;
      auVar174._12_4_ = -fVar328;
      auVar98._0_4_ = fVar325 * fVar327 - fVar328 * fVar321;
      auVar98._4_4_ = auVar98._0_4_;
      auVar98._8_4_ = auVar98._0_4_;
      auVar98._12_4_ = auVar98._0_4_;
      auVar139 = divps(auVar174,auVar98);
      auVar70 = divps(auVar157,auVar98);
      fVar176 = auVar139._0_4_;
      fVar161 = auVar139._4_4_;
      fVar302 = auVar70._0_4_;
      fVar164 = auVar70._4_4_;
      fVar159 = fVar159 - (fVar316 * fVar302 + fVar255 * fVar176);
      fVar327 = fVar315 - (fVar316 * fVar164 + fVar255 * fVar161);
      fVar328 = fVar315 - (fVar316 * auVar70._8_4_ + fVar255 * auVar139._8_4_);
      fVar315 = fVar315 - (fVar316 * auVar70._12_4_ + fVar255 * auVar139._12_4_);
      auVar129._0_8_ = CONCAT44(fVar161 * fVar331,fVar161 * fVar220);
      auVar129._8_4_ = fVar161 * fVar221;
      auVar129._12_4_ = fVar161 * fVar208;
      auVar99._0_4_ = fVar161 * fVar317;
      auVar99._4_4_ = fVar161 * fVar218;
      auVar99._8_4_ = fVar161 * fVar162;
      auVar99._12_4_ = fVar161 * fVar209;
      auVar335._8_4_ = auVar129._8_4_;
      auVar335._0_8_ = auVar129._0_8_;
      auVar335._12_4_ = auVar129._12_4_;
      auVar141 = minps(auVar335,auVar99);
      auVar70 = maxps(auVar99,auVar129);
      auVar202._0_8_ = CONCAT44(fVar164 * fVar208,fVar164 * fVar221);
      auVar202._8_4_ = fVar164 * fVar222;
      auVar202._12_4_ = fVar164 * fVar236;
      auVar130._0_4_ = fVar164 * fVar162;
      auVar130._4_4_ = fVar164 * fVar209;
      auVar130._8_4_ = fVar164 * fVar179;
      auVar130._12_4_ = fVar164 * fVar175;
      auVar280._8_4_ = auVar202._8_4_;
      auVar280._0_8_ = auVar202._0_8_;
      auVar280._12_4_ = auVar202._12_4_;
      auVar262 = minps(auVar280,auVar130);
      auVar139 = maxps(auVar130,auVar202);
      fVar255 = 0.0 - (auVar139._0_4_ + auVar70._0_4_);
      fVar316 = 1.0 - (auVar139._4_4_ + auVar70._4_4_);
      fVar321 = 0.0 - (auVar139._8_4_ + auVar70._8_4_);
      fVar325 = 0.0 - (auVar139._12_4_ + auVar70._12_4_);
      fVar178 = 0.0 - (auVar262._0_4_ + auVar141._0_4_);
      fVar319 = 1.0 - (auVar262._4_4_ + auVar141._4_4_);
      fVar305 = 0.0 - (auVar262._8_4_ + auVar141._8_4_);
      fVar330 = 0.0 - (auVar262._12_4_ + auVar141._12_4_);
      auVar131._0_8_ = CONCAT44(fVar238 * fVar316,fVar237 * fVar255);
      auVar131._8_4_ = fVar240 * fVar321;
      auVar131._12_4_ = fVar242 * fVar325;
      auVar294._0_8_ = CONCAT44(fVar331 * fVar176,fVar220 * fVar176);
      auVar294._8_4_ = fVar221 * fVar176;
      auVar294._12_4_ = fVar208 * fVar176;
      auVar203._0_4_ = fVar176 * fVar317;
      auVar203._4_4_ = fVar176 * fVar218;
      auVar203._8_4_ = fVar176 * fVar162;
      auVar203._12_4_ = fVar176 * fVar209;
      auVar281._8_4_ = auVar294._8_4_;
      auVar281._0_8_ = auVar294._0_8_;
      auVar281._12_4_ = auVar294._12_4_;
      auVar139 = minps(auVar281,auVar203);
      auVar70 = maxps(auVar203,auVar294);
      auVar251._0_8_ = CONCAT44(fVar208 * fVar302,fVar221 * fVar302);
      auVar251._8_4_ = fVar222 * fVar302;
      auVar251._12_4_ = fVar236 * fVar302;
      auVar295._0_4_ = fVar302 * fVar162;
      auVar295._4_4_ = fVar302 * fVar209;
      auVar295._8_4_ = fVar302 * fVar179;
      auVar295._12_4_ = fVar302 * fVar175;
      auVar334._8_4_ = auVar251._8_4_;
      auVar334._0_8_ = auVar251._0_8_;
      auVar334._12_4_ = auVar251._12_4_;
      auVar141 = minps(auVar334,auVar295);
      auVar282._0_4_ = fVar237 * fVar178;
      auVar282._4_4_ = fVar238 * fVar319;
      auVar282._8_4_ = fVar240 * fVar305;
      auVar282._12_4_ = fVar242 * fVar330;
      auVar100._0_8_ = CONCAT44(fVar316 * fVar245,fVar255 * fVar243);
      auVar100._8_4_ = fVar321 * fVar270;
      auVar100._12_4_ = fVar325 * fVar207;
      auVar213._0_4_ = fVar178 * fVar243;
      auVar213._4_4_ = fVar319 * fVar245;
      auVar213._8_4_ = fVar305 * fVar270;
      auVar213._12_4_ = fVar330 * fVar207;
      auVar262 = maxps(auVar295,auVar251);
      fVar175 = 1.0 - (auVar262._0_4_ + auVar70._0_4_);
      fVar255 = 0.0 - (auVar262._4_4_ + auVar70._4_4_);
      fVar316 = 0.0 - (auVar262._8_4_ + auVar70._8_4_);
      fVar321 = 0.0 - (auVar262._12_4_ + auVar70._12_4_);
      fVar325 = 1.0 - (auVar141._0_4_ + auVar139._0_4_);
      fVar317 = 0.0 - (auVar141._4_4_ + auVar139._4_4_);
      fVar178 = 0.0 - (auVar141._8_4_ + auVar139._8_4_);
      fVar162 = 0.0 - (auVar141._12_4_ + auVar139._12_4_);
      auVar252._0_8_ = CONCAT44(fVar238 * fVar255,fVar237 * fVar175);
      auVar252._8_4_ = fVar240 * fVar316;
      auVar252._12_4_ = fVar242 * fVar321;
      auVar313._0_4_ = fVar237 * fVar325;
      auVar313._4_4_ = fVar238 * fVar317;
      auVar313._8_4_ = fVar240 * fVar178;
      auVar313._12_4_ = fVar242 * fVar162;
      auVar204._0_8_ = CONCAT44(fVar255 * fVar245,fVar175 * fVar243);
      auVar204._8_4_ = fVar316 * fVar270;
      auVar204._12_4_ = fVar321 * fVar207;
      auVar269._0_4_ = fVar325 * fVar243;
      auVar269._4_4_ = fVar317 * fVar245;
      auVar269._8_4_ = fVar178 * fVar270;
      auVar269._12_4_ = fVar162 * fVar207;
      auVar296._8_4_ = auVar252._8_4_;
      auVar296._0_8_ = auVar252._0_8_;
      auVar296._12_4_ = auVar252._12_4_;
      auVar70 = minps(auVar296,auVar313);
      auVar324._8_4_ = auVar204._8_4_;
      auVar324._0_8_ = auVar204._0_8_;
      auVar324._12_4_ = auVar204._12_4_;
      auVar139 = minps(auVar324,auVar269);
      auVar264 = minps(auVar70,auVar139);
      auVar139 = maxps(auVar313,auVar252);
      auVar70 = maxps(auVar269,auVar204);
      auVar262 = maxps(auVar70,auVar139);
      auVar253._8_4_ = auVar131._8_4_;
      auVar253._0_8_ = auVar131._0_8_;
      auVar253._12_4_ = auVar131._12_4_;
      auVar139 = minps(auVar253,auVar282);
      auVar205._8_4_ = auVar100._8_4_;
      auVar205._0_8_ = auVar100._0_8_;
      auVar205._12_4_ = auVar100._12_4_;
      auVar70 = minps(auVar205,auVar213);
      auVar139 = minps(auVar139,auVar70);
      auVar141 = maxps(auVar282,auVar131);
      auVar70 = maxps(auVar213,auVar100);
      auVar70 = maxps(auVar70,auVar141);
      auVar254._0_4_ = auVar264._4_4_ + auVar264._0_4_ + fVar159;
      auVar254._4_4_ = auVar139._4_4_ + auVar139._0_4_ + fVar327;
      auVar254._8_4_ = auVar264._8_4_ + auVar264._4_4_ + fVar328;
      auVar254._12_4_ = auVar264._12_4_ + auVar139._4_4_ + fVar315;
      fVar175 = auVar262._4_4_ + auVar262._0_4_ + fVar159;
      fVar207 = auVar70._4_4_ + auVar70._0_4_ + fVar327;
      auVar101._4_4_ = fVar207;
      auVar101._0_4_ = fVar175;
      auVar139 = maxps(_local_508,auVar254);
      auVar101._8_4_ = auVar262._8_4_ + auVar262._4_4_ + fVar328;
      auVar101._12_4_ = auVar262._12_4_ + auVar70._4_4_ + fVar315;
      auVar70 = minps(auVar101,auVar234);
      iVar63 = -(uint)(auVar70._0_4_ < auVar139._0_4_);
      iVar65 = -(uint)(auVar70._4_4_ < auVar139._4_4_);
      auVar103._4_4_ = iVar65;
      auVar103._0_4_ = iVar63;
      auVar103._8_4_ = iVar65;
      auVar103._12_4_ = iVar65;
      auVar102._8_8_ = auVar103._8_8_;
      auVar102._4_4_ = iVar63;
      auVar102._0_4_ = iVar63;
      iVar63 = movmskpd((uint)(fVar318 < 0.0),auVar102);
      auVar91 = _local_508;
      if (iVar63 == 0) {
        bVar52 = 0;
        if ((fVar135 < auVar254._0_4_) && (fVar175 < fVar163)) {
          bVar52 = -(fVar207 < fVar109) & fVar108 < auVar254._4_4_;
        }
        bVar52 = bVar61 | bVar52;
        uVar55 = (ulong)CONCAT31(uVar26,bVar52);
        if (bVar52 != 1) goto LAB_00b1364d;
        uVar55 = 200;
        do {
          fVar108 = 1.0 - fVar159;
          fVar175 = fVar159 * fVar159 * fVar159;
          fVar163 = fVar159 * fVar159 * 3.0 * fVar108;
          fVar109 = fVar108 * fVar108 * fVar108;
          fVar207 = fVar159 * 3.0 * fVar108 * fVar108;
          fVar135 = fVar109 * fVar283 +
                    fVar207 * fVar304 + fVar163 * fVar235 + fVar175 * (float)local_118._0_4_;
          fVar108 = fVar109 * fVar284 +
                    fVar207 * fVar314 + fVar163 * fVar239 + fVar175 * (float)local_118._4_4_;
          fVar135 = ((fVar109 * 0.0 + fVar207 * fVar299 + fVar163 * fVar241 + fVar175 * fStack_110)
                    - fVar135) * fVar327 + fVar135;
          fVar108 = ((fVar109 * 0.0 + fVar207 * fVar301 + fVar163 * fVar244 + fVar175 * fStack_10c)
                    - fVar108) * fVar327 + fVar108;
          fVar159 = fVar159 - (fVar108 * fVar302 + fVar135 * fVar176);
          fVar327 = fVar327 - (fVar108 * fVar164 + fVar135 * fVar161);
          fVar135 = (float)((uint)fVar135 & (uint)DAT_01f7b6c0);
          fVar108 = (float)((uint)fVar108 & DAT_01f7b6c0._4_4_);
          if (fVar108 <= fVar135) {
            fVar108 = fVar135;
          }
          if (fVar108 < local_128) {
            if ((((0.0 <= fVar159) && (fVar159 <= 1.0)) && (0.0 <= fVar327)) && (fVar327 <= 1.0)) {
              fVar108 = pre->ray_space[k].vx.field_0.m128[2];
              fVar109 = pre->ray_space[k].vy.field_0.m128[2];
              fVar135 = pre->ray_space[k].vz.field_0.m128[2];
              fVar316 = 1.0 - fVar327;
              fVar255 = 1.0 - fVar159;
              fVar163 = fVar255 * fVar255 * fVar255;
              fVar175 = fVar159 * 3.0 * fVar255 * fVar255;
              fVar270 = fVar159 * fVar159 * fVar159;
              fVar207 = fVar159 * fVar159 * 3.0 * fVar255;
              fVar108 = ((fStack_160 * fVar135 + fStack_164 * fVar109 + local_168 * fVar108) *
                         fVar316 +
                        (fStack_1a0 * fVar135 + fStack_1a4 * fVar109 + local_1a8 * fVar108) *
                        fVar327) * fVar163 +
                        ((fStack_170 * fVar135 + fStack_174 * fVar109 + local_178 * fVar108) *
                         fVar316 +
                        (fStack_1b0 * fVar135 + fStack_1b4 * fVar109 + local_1b8 * fVar108) *
                        fVar327) * fVar175 +
                        ((fStack_180 * fVar135 + fStack_184 * fVar109 + local_188 * fVar108) *
                         fVar316 +
                        (fStack_1c0 * fVar135 + fStack_1c4 * fVar109 + local_1c8 * fVar108) *
                        fVar327) * fVar207 +
                        (fVar316 * (fStack_190 * fVar135 +
                                   fStack_194 * fVar109 + local_198 * fVar108) +
                        (fVar135 * fStack_1d0 + fVar109 * fStack_1d4 + fVar108 * local_1d8) *
                        fVar327) * fVar270;
              if ((fVar107 <= fVar108) &&
                 (fVar109 = *(float *)(ray + k * 4 + 0x80), fVar108 <= fVar109)) {
                fVar321 = 1.0 - fVar327;
                fVar325 = 1.0 - fVar327;
                fVar328 = 1.0 - fVar327;
                fVar135 = fVar211 * fVar321 + fVar256 * fVar327;
                fVar316 = fVar215 * fVar325 + fVar273 * fVar327;
                fVar318 = fVar217 * fVar328 + fVar257 * fVar327;
                fVar302 = fVar271 * fVar321 + fVar137 * fVar327;
                fVar315 = fVar320 * fVar325 + fVar150 * fVar327;
                fVar161 = fVar246 * fVar328 + fVar160 * fVar327;
                fVar164 = fVar302 - fVar135;
                fVar176 = fVar315 - fVar316;
                fVar317 = fVar161 - fVar318;
                fVar135 = (((fVar135 - (fVar322 * fVar321 + fVar136 * fVar327)) * fVar255 +
                           fVar159 * fVar164) * fVar255 +
                          (fVar164 * fVar255 +
                          ((fVar321 * fVar177 + local_298 * fVar327) - fVar302) * fVar159) * fVar159
                          ) * 3.0;
                fVar316 = (((fVar316 - (fVar326 * fVar325 + fVar148 * fVar327)) * fVar255 +
                           fVar159 * fVar176) * fVar255 +
                          (fVar176 * fVar255 +
                          ((fVar325 * fVar180 + fStack_294 * fVar327) - fVar315) * fVar159) *
                          fVar159) * 3.0;
                fVar255 = (((fVar318 - (fVar329 * fVar328 + fVar158 * fVar327)) * fVar255 +
                           fVar159 * fVar317) * fVar255 +
                          (fVar317 * fVar255 +
                          ((fVar328 * fVar206 + fStack_290 * fVar327) - fVar161) * fVar159) *
                          fVar159) * 3.0;
                pGVar15 = (context->scene->geometries).items[uVar64].ptr;
                uVar55 = (ulong)*(uint *)(ray + k * 4 + 0x90);
                if ((pGVar15->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  fVar318 = fVar163 * local_2a8 +
                            fVar175 * local_2b8 + fVar207 * local_2c8 + fVar270 * local_2d8;
                  fVar321 = fVar163 * fStack_2a4 +
                            fVar175 * fStack_2b4 + fVar207 * fStack_2c4 + fVar270 * fStack_2d4;
                  fVar163 = fVar163 * fStack_2a0 +
                            fVar175 * fStack_2b0 + fVar207 * fStack_2c0 + fVar270 * fStack_2d0;
                  fVar175 = fVar321 * fVar135 - fVar316 * fVar318;
                  fVar207 = fVar163 * fVar316 - fVar255 * fVar321;
                  fVar135 = fVar318 * fVar255 - fVar135 * fVar163;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar15->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x80) = fVar108;
                    *(float *)(ray + k * 4 + 0xc0) = fVar207;
                    *(float *)(ray + k * 4 + 0xd0) = fVar135;
                    *(float *)(ray + k * 4 + 0xe0) = fVar175;
                    *(float *)(ray + k * 4 + 0xf0) = fVar159;
                    *(float *)(ray + k * 4 + 0x100) = fVar327;
                    *(uint *)(ray + k * 4 + 0x110) = uVar66;
                    *(uint *)(ray + k * 4 + 0x120) = uVar64;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    uVar67 = context->user->instPrimID[0];
                    uVar55 = (ulong)uVar67;
                    *(uint *)(ray + k * 4 + 0x140) = uVar67;
                  }
                  else {
                    local_e8 = fVar207;
                    fStack_e4 = fVar207;
                    fStack_e0 = fVar207;
                    fStack_dc = fVar207;
                    local_d8 = fVar135;
                    fStack_d4 = fVar135;
                    fStack_d0 = fVar135;
                    fStack_cc = fVar135;
                    local_c8 = fVar175;
                    fStack_c4 = fVar175;
                    fStack_c0 = fVar175;
                    fStack_bc = fVar175;
                    local_b8 = fVar159;
                    fStack_b4 = fVar159;
                    fStack_b0 = fVar159;
                    fStack_ac = fVar159;
                    local_a8 = fVar327;
                    fStack_a4 = fVar327;
                    fStack_a0 = fVar327;
                    fStack_9c = fVar327;
                    local_98 = CONCAT44(uStack_304,local_308);
                    uStack_90 = CONCAT44(uStack_2fc,uStack_300);
                    local_88 = CONCAT44(uStack_2f4,local_2f8);
                    uStack_80 = CONCAT44(uStack_2ec,uStack_2f0);
                    local_78 = context->user->instID[0];
                    uStack_74 = local_78;
                    uStack_70 = local_78;
                    uStack_6c = local_78;
                    local_68 = context->user->instPrimID[0];
                    uStack_64 = local_68;
                    uStack_60 = local_68;
                    uStack_5c = local_68;
                    *(float *)(ray + k * 4 + 0x80) = fVar108;
                    local_3b8 = *local_3a0;
                    local_388.valid = (int *)local_3b8;
                    local_388.geometryUserPtr = pGVar15->userPtr;
                    local_388.context = context->user;
                    local_388.hit = (RTCHitN *)&local_e8;
                    local_388.N = 4;
                    p_Var56 = pGVar15->intersectionFilterN;
                    local_388.ray = (RTCRayN *)ray;
                    if (p_Var56 != (RTCFilterFunctionN)0x0) {
                      p_Var56 = (RTCFilterFunctionN)(*p_Var56)(&local_388);
                      ray = local_4f8;
                    }
                    auVar132._0_4_ = -(uint)(local_3b8._0_4_ == 0);
                    auVar132._4_4_ = -(uint)(local_3b8._4_4_ == 0);
                    auVar132._8_4_ = -(uint)(local_3b8._8_4_ == 0);
                    auVar132._12_4_ = -(uint)(local_3b8._12_4_ == 0);
                    uVar67 = movmskps((int)p_Var56,auVar132);
                    pRVar57 = (RayHitK<4> *)(ulong)(uVar67 ^ 0xf);
                    if ((uVar67 ^ 0xf) == 0) {
                      auVar132 = auVar132 ^ _DAT_01f7ae20;
                    }
                    else {
                      p_Var56 = context->args->filter;
                      if ((p_Var56 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar15->field_8).field_0x2 & 0x40) != 0)))) {
                        p_Var56 = (RTCFilterFunctionN)(*p_Var56)(&local_388);
                        ray = local_4f8;
                      }
                      auVar104._0_4_ = -(uint)(local_3b8._0_4_ == 0);
                      auVar104._4_4_ = -(uint)(local_3b8._4_4_ == 0);
                      auVar104._8_4_ = -(uint)(local_3b8._8_4_ == 0);
                      auVar104._12_4_ = -(uint)(local_3b8._12_4_ == 0);
                      auVar132 = auVar104 ^ _DAT_01f7ae20;
                      uVar67 = movmskps((int)p_Var56,auVar104);
                      pRVar57 = (RayHitK<4> *)(ulong)(uVar67 ^ 0xf);
                      if ((uVar67 ^ 0xf) != 0) {
                        fVar108 = *(float *)(local_388.hit + 4);
                        fVar135 = *(float *)(local_388.hit + 8);
                        fVar163 = *(float *)(local_388.hit + 0xc);
                        *(uint *)(local_388.ray + 0xc0) =
                             ~auVar104._0_4_ & (uint)*(float *)local_388.hit |
                             *(uint *)(local_388.ray + 0xc0) & auVar104._0_4_;
                        *(uint *)(local_388.ray + 0xc4) =
                             ~auVar104._4_4_ & (uint)fVar108 |
                             *(uint *)(local_388.ray + 0xc4) & auVar104._4_4_;
                        *(uint *)(local_388.ray + 200) =
                             ~auVar104._8_4_ & (uint)fVar135 |
                             *(uint *)(local_388.ray + 200) & auVar104._8_4_;
                        *(uint *)(local_388.ray + 0xcc) =
                             ~auVar104._12_4_ & (uint)fVar163 |
                             *(uint *)(local_388.ray + 0xcc) & auVar104._12_4_;
                        fVar108 = *(float *)(local_388.hit + 0x14);
                        fVar135 = *(float *)(local_388.hit + 0x18);
                        fVar163 = *(float *)(local_388.hit + 0x1c);
                        *(uint *)(local_388.ray + 0xd0) =
                             ~auVar104._0_4_ & (uint)*(float *)(local_388.hit + 0x10) |
                             *(uint *)(local_388.ray + 0xd0) & auVar104._0_4_;
                        *(uint *)(local_388.ray + 0xd4) =
                             ~auVar104._4_4_ & (uint)fVar108 |
                             *(uint *)(local_388.ray + 0xd4) & auVar104._4_4_;
                        *(uint *)(local_388.ray + 0xd8) =
                             ~auVar104._8_4_ & (uint)fVar135 |
                             *(uint *)(local_388.ray + 0xd8) & auVar104._8_4_;
                        *(uint *)(local_388.ray + 0xdc) =
                             ~auVar104._12_4_ & (uint)fVar163 |
                             *(uint *)(local_388.ray + 0xdc) & auVar104._12_4_;
                        fVar108 = *(float *)(local_388.hit + 0x24);
                        fVar135 = *(float *)(local_388.hit + 0x28);
                        fVar163 = *(float *)(local_388.hit + 0x2c);
                        *(uint *)(local_388.ray + 0xe0) =
                             ~auVar104._0_4_ & (uint)*(float *)(local_388.hit + 0x20) |
                             *(uint *)(local_388.ray + 0xe0) & auVar104._0_4_;
                        *(uint *)(local_388.ray + 0xe4) =
                             ~auVar104._4_4_ & (uint)fVar108 |
                             *(uint *)(local_388.ray + 0xe4) & auVar104._4_4_;
                        *(uint *)(local_388.ray + 0xe8) =
                             ~auVar104._8_4_ & (uint)fVar135 |
                             *(uint *)(local_388.ray + 0xe8) & auVar104._8_4_;
                        *(uint *)(local_388.ray + 0xec) =
                             ~auVar104._12_4_ & (uint)fVar163 |
                             *(uint *)(local_388.ray + 0xec) & auVar104._12_4_;
                        fVar108 = *(float *)(local_388.hit + 0x34);
                        fVar135 = *(float *)(local_388.hit + 0x38);
                        fVar163 = *(float *)(local_388.hit + 0x3c);
                        *(uint *)(local_388.ray + 0xf0) =
                             ~auVar104._0_4_ & (uint)*(float *)(local_388.hit + 0x30) |
                             *(uint *)(local_388.ray + 0xf0) & auVar104._0_4_;
                        *(uint *)(local_388.ray + 0xf4) =
                             ~auVar104._4_4_ & (uint)fVar108 |
                             *(uint *)(local_388.ray + 0xf4) & auVar104._4_4_;
                        *(uint *)(local_388.ray + 0xf8) =
                             ~auVar104._8_4_ & (uint)fVar135 |
                             *(uint *)(local_388.ray + 0xf8) & auVar104._8_4_;
                        *(uint *)(local_388.ray + 0xfc) =
                             ~auVar104._12_4_ & (uint)fVar163 |
                             *(uint *)(local_388.ray + 0xfc) & auVar104._12_4_;
                        fVar108 = *(float *)(local_388.hit + 0x44);
                        fVar135 = *(float *)(local_388.hit + 0x48);
                        fVar163 = *(float *)(local_388.hit + 0x4c);
                        *(uint *)(local_388.ray + 0x100) =
                             ~auVar104._0_4_ & (uint)*(float *)(local_388.hit + 0x40) |
                             *(uint *)(local_388.ray + 0x100) & auVar104._0_4_;
                        *(uint *)(local_388.ray + 0x104) =
                             ~auVar104._4_4_ & (uint)fVar108 |
                             *(uint *)(local_388.ray + 0x104) & auVar104._4_4_;
                        *(uint *)(local_388.ray + 0x108) =
                             ~auVar104._8_4_ & (uint)fVar135 |
                             *(uint *)(local_388.ray + 0x108) & auVar104._8_4_;
                        *(uint *)(local_388.ray + 0x10c) =
                             ~auVar104._12_4_ & (uint)fVar163 |
                             *(uint *)(local_388.ray + 0x10c) & auVar104._12_4_;
                        fVar108 = *(float *)(local_388.hit + 0x54);
                        fVar135 = *(float *)(local_388.hit + 0x58);
                        fVar163 = *(float *)(local_388.hit + 0x5c);
                        *(uint *)(local_388.ray + 0x110) =
                             *(uint *)(local_388.ray + 0x110) & auVar104._0_4_ |
                             ~auVar104._0_4_ & (uint)*(float *)(local_388.hit + 0x50);
                        *(uint *)(local_388.ray + 0x114) =
                             *(uint *)(local_388.ray + 0x114) & auVar104._4_4_ |
                             ~auVar104._4_4_ & (uint)fVar108;
                        *(uint *)(local_388.ray + 0x118) =
                             *(uint *)(local_388.ray + 0x118) & auVar104._8_4_ |
                             ~auVar104._8_4_ & (uint)fVar135;
                        *(uint *)(local_388.ray + 0x11c) =
                             *(uint *)(local_388.ray + 0x11c) & auVar104._12_4_ |
                             ~auVar104._12_4_ & (uint)fVar163;
                        fVar108 = *(float *)(local_388.hit + 100);
                        fVar135 = *(float *)(local_388.hit + 0x68);
                        fVar163 = *(float *)(local_388.hit + 0x6c);
                        *(uint *)(local_388.ray + 0x120) =
                             *(uint *)(local_388.ray + 0x120) & auVar104._0_4_ |
                             ~auVar104._0_4_ & (uint)*(float *)(local_388.hit + 0x60);
                        *(uint *)(local_388.ray + 0x124) =
                             *(uint *)(local_388.ray + 0x124) & auVar104._4_4_ |
                             ~auVar104._4_4_ & (uint)fVar108;
                        *(uint *)(local_388.ray + 0x128) =
                             *(uint *)(local_388.ray + 0x128) & auVar104._8_4_ |
                             ~auVar104._8_4_ & (uint)fVar135;
                        *(uint *)(local_388.ray + 300) =
                             *(uint *)(local_388.ray + 300) & auVar104._12_4_ |
                             ~auVar104._12_4_ & (uint)fVar163;
                        fVar108 = *(float *)(local_388.hit + 0x74);
                        fVar135 = *(float *)(local_388.hit + 0x78);
                        fVar163 = *(float *)(local_388.hit + 0x7c);
                        *(uint *)(local_388.ray + 0x130) =
                             ~auVar104._0_4_ & (uint)*(float *)(local_388.hit + 0x70) |
                             *(uint *)(local_388.ray + 0x130) & auVar104._0_4_;
                        *(uint *)(local_388.ray + 0x134) =
                             ~auVar104._4_4_ & (uint)fVar108 |
                             *(uint *)(local_388.ray + 0x134) & auVar104._4_4_;
                        *(uint *)(local_388.ray + 0x138) =
                             ~auVar104._8_4_ & (uint)fVar135 |
                             *(uint *)(local_388.ray + 0x138) & auVar104._8_4_;
                        *(uint *)(local_388.ray + 0x13c) =
                             ~auVar104._12_4_ & (uint)fVar163 |
                             *(uint *)(local_388.ray + 0x13c) & auVar104._12_4_;
                        *(undefined1 (*) [16])(local_388.ray + 0x140) =
                             ~auVar104 & *(undefined1 (*) [16])(local_388.hit + 0x80) |
                             *(undefined1 (*) [16])(local_388.ray + 0x140) & auVar104;
                        pRVar57 = (RayHitK<4> *)local_388.ray;
                      }
                    }
                    auVar133._0_4_ = auVar132._0_4_ << 0x1f;
                    auVar133._4_4_ = auVar132._4_4_ << 0x1f;
                    auVar133._8_4_ = auVar132._8_4_ << 0x1f;
                    auVar133._12_4_ = auVar132._12_4_ << 0x1f;
                    uVar67 = movmskps((int)pRVar57,auVar133);
                    uVar55 = (ulong)uVar67;
                    if (uVar67 == 0) {
                      *(float *)(ray + k * 4 + 0x80) = fVar109;
                    }
                  }
                }
              }
            }
            break;
          }
          uVar55 = uVar55 - 1;
        } while (uVar55 != 0);
      }
    }
  }
  goto LAB_00b13cc6;
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }